

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  ulong uVar70;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ulong uVar71;
  byte bVar72;
  byte bVar73;
  long lVar74;
  bool bVar75;
  bool bVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar134;
  uint uVar135;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar127 [32];
  undefined1 auVar88 [16];
  undefined1 auVar128 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  float pp;
  float fVar141;
  undefined4 uVar142;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar143;
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar218;
  float fVar221;
  float fVar222;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar228 [32];
  undefined1 auVar232 [64];
  float t;
  float fVar233;
  float fVar238;
  undefined1 auVar234 [16];
  float fVar236;
  float fVar237;
  undefined1 auVar235 [64];
  float s;
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  float local_920;
  undefined8 local_900;
  undefined8 uStack_8f8;
  ulong local_8e8;
  ulong local_8e0;
  uint local_8d4;
  uint local_8d0;
  undefined4 local_8cc;
  float local_8c8;
  float local_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  Primitive *local_6e0;
  ulong local_6d8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  RTCHitN local_4c0 [16];
  undefined1 auStack_4b0 [16];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  float local_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [16];
  undefined8 local_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  uint local_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  uint uStack_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte local_180 [32];
  uint auStack_160 [8];
  float local_140 [2];
  uint local_138 [66];
  undefined1 auVar121 [32];
  undefined1 auVar129 [32];
  undefined1 auVar132 [32];
  undefined1 auVar245 [64];
  
  PVar1 = prim[1];
  uVar77 = (ulong)(byte)PVar1;
  fVar226 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar81 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar81 = vinsertps_avx(auVar81,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar82 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar87 = vinsertps_avx(auVar82,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar88 = vsubps_avx(auVar81,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  fVar198 = fVar226 * auVar88._0_4_;
  fVar141 = fVar226 * auVar87._0_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar77 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar81);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar77 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar82);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar77 * 6 + 6);
  auVar95 = vpmovsxbd_avx2(auVar79);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar77 * 0xb + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + (uint)(byte)PVar1 * 0xc + uVar77 + 6);
  auVar98 = vpmovsxbd_avx2(auVar80);
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar70 = (ulong)(uint)((int)(uVar77 * 9) * 2);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar99 = vpmovsxbd_avx2(auVar234);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar70 + uVar77 + 6);
  auVar102 = vpmovsxbd_avx2(auVar86);
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar100 = vcvtdq2ps_avx(auVar102);
  uVar71 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar91 = vpmovsxbd_avx2(auVar85);
  auVar101 = vcvtdq2ps_avx(auVar91);
  auVar109._4_4_ = fVar141;
  auVar109._0_4_ = fVar141;
  auVar109._8_4_ = fVar141;
  auVar109._12_4_ = fVar141;
  auVar109._16_4_ = fVar141;
  auVar109._20_4_ = fVar141;
  auVar109._24_4_ = fVar141;
  auVar109._28_4_ = fVar141;
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  auVar103 = ZEXT1632(CONCAT412(fVar226 * auVar87._12_4_,
                                CONCAT48(fVar226 * auVar87._8_4_,
                                         CONCAT44(fVar226 * auVar87._4_4_,fVar141))));
  auVar92 = vpermps_avx2(auVar111,auVar103);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar90 = vpermps_avx512vl(auVar89,auVar103);
  fVar141 = auVar90._0_4_;
  fVar218 = auVar90._4_4_;
  auVar103._4_4_ = fVar218 * auVar95._4_4_;
  auVar103._0_4_ = fVar141 * auVar95._0_4_;
  fVar221 = auVar90._8_4_;
  auVar103._8_4_ = fVar221 * auVar95._8_4_;
  fVar222 = auVar90._12_4_;
  auVar103._12_4_ = fVar222 * auVar95._12_4_;
  fVar223 = auVar90._16_4_;
  auVar103._16_4_ = fVar223 * auVar95._16_4_;
  fVar224 = auVar90._20_4_;
  auVar103._20_4_ = fVar224 * auVar95._20_4_;
  fVar225 = auVar90._24_4_;
  auVar103._24_4_ = fVar225 * auVar95._24_4_;
  auVar103._28_4_ = auVar102._28_4_;
  auVar102._4_4_ = auVar98._4_4_ * fVar218;
  auVar102._0_4_ = auVar98._0_4_ * fVar141;
  auVar102._8_4_ = auVar98._8_4_ * fVar221;
  auVar102._12_4_ = auVar98._12_4_ * fVar222;
  auVar102._16_4_ = auVar98._16_4_ * fVar223;
  auVar102._20_4_ = auVar98._20_4_ * fVar224;
  auVar102._24_4_ = auVar98._24_4_ * fVar225;
  auVar102._28_4_ = auVar91._28_4_;
  auVar91._4_4_ = auVar101._4_4_ * fVar218;
  auVar91._0_4_ = auVar101._0_4_ * fVar141;
  auVar91._8_4_ = auVar101._8_4_ * fVar221;
  auVar91._12_4_ = auVar101._12_4_ * fVar222;
  auVar91._16_4_ = auVar101._16_4_ * fVar223;
  auVar91._20_4_ = auVar101._20_4_ * fVar224;
  auVar91._24_4_ = auVar101._24_4_ * fVar225;
  auVar91._28_4_ = auVar90._28_4_;
  auVar81 = vfmadd231ps_fma(auVar103,auVar92,auVar93);
  auVar82 = vfmadd231ps_fma(auVar102,auVar92,auVar97);
  auVar79 = vfmadd231ps_fma(auVar91,auVar100,auVar92);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar109,auVar94);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar109,auVar96);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar99,auVar109);
  auVar110._4_4_ = fVar198;
  auVar110._0_4_ = fVar198;
  auVar110._8_4_ = fVar198;
  auVar110._12_4_ = fVar198;
  auVar110._16_4_ = fVar198;
  auVar110._20_4_ = fVar198;
  auVar110._24_4_ = fVar198;
  auVar110._28_4_ = fVar198;
  auVar91 = ZEXT1632(CONCAT412(fVar226 * auVar88._12_4_,
                               CONCAT48(fVar226 * auVar88._8_4_,
                                        CONCAT44(fVar226 * auVar88._4_4_,fVar198))));
  auVar102 = vpermps_avx2(auVar111,auVar91);
  auVar91 = vpermps_avx512vl(auVar89,auVar91);
  auVar92 = vmulps_avx512vl(auVar91,auVar95);
  auVar105._0_4_ = auVar91._0_4_ * auVar98._0_4_;
  auVar105._4_4_ = auVar91._4_4_ * auVar98._4_4_;
  auVar105._8_4_ = auVar91._8_4_ * auVar98._8_4_;
  auVar105._12_4_ = auVar91._12_4_ * auVar98._12_4_;
  auVar105._16_4_ = auVar91._16_4_ * auVar98._16_4_;
  auVar105._20_4_ = auVar91._20_4_ * auVar98._20_4_;
  auVar105._24_4_ = auVar91._24_4_ * auVar98._24_4_;
  auVar105._28_4_ = 0;
  auVar98._4_4_ = auVar91._4_4_ * auVar101._4_4_;
  auVar98._0_4_ = auVar91._0_4_ * auVar101._0_4_;
  auVar98._8_4_ = auVar91._8_4_ * auVar101._8_4_;
  auVar98._12_4_ = auVar91._12_4_ * auVar101._12_4_;
  auVar98._16_4_ = auVar91._16_4_ * auVar101._16_4_;
  auVar98._20_4_ = auVar91._20_4_ * auVar101._20_4_;
  auVar98._24_4_ = auVar91._24_4_ * auVar101._24_4_;
  auVar98._28_4_ = auVar95._28_4_;
  auVar93 = vfmadd231ps_avx512vl(auVar92,auVar102,auVar93);
  auVar83 = vfmadd231ps_fma(auVar105,auVar102,auVar97);
  auVar84 = vfmadd231ps_fma(auVar98,auVar102,auVar100);
  auVar93 = vfmadd231ps_avx512vl(auVar93,auVar110,auVar94);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar110,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar110,auVar99);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar255 = ZEXT3264(auVar94);
  vandps_avx512vl(ZEXT1632(auVar81),auVar94);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar107._16_4_ = 0x219392ef;
  auVar107._20_4_ = 0x219392ef;
  auVar107._24_4_ = 0x219392ef;
  auVar107._28_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar94,auVar107,1);
  bVar76 = (bool)((byte)uVar70 & 1);
  auVar92._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._0_4_;
  bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._4_4_;
  bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._8_4_;
  bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar82),auVar94);
  uVar70 = vcmpps_avx512vl(auVar92,auVar107,1);
  bVar76 = (bool)((byte)uVar70 & 1);
  auVar89._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._0_4_;
  bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._4_4_;
  bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._8_4_;
  bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._12_4_;
  auVar89._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar89._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar89._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar89._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar79),auVar94);
  uVar70 = vcmpps_avx512vl(auVar89,auVar107,1);
  bVar76 = (bool)((byte)uVar70 & 1);
  auVar94._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._0_4_;
  bVar76 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._4_4_;
  bVar76 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._8_4_;
  bVar76 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar79._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar70 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar92);
  auVar108._8_4_ = 0x3f800000;
  auVar108._0_8_ = &DAT_3f8000003f800000;
  auVar108._12_4_ = 0x3f800000;
  auVar108._16_4_ = 0x3f800000;
  auVar108._20_4_ = 0x3f800000;
  auVar108._24_4_ = 0x3f800000;
  auVar108._28_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar92,auVar95,auVar108);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar89);
  auVar82 = vfnmadd213ps_fma(auVar89,auVar95,auVar108);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar94);
  auVar79 = vfnmadd213ps_fma(auVar94,auVar95,auVar108);
  auVar79 = vfmadd132ps_fma(ZEXT1632(auVar79),auVar95,auVar95);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 7 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar95 = vsubps_avx512vl(auVar94,auVar93);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 9 + 6));
  auVar99._4_4_ = auVar81._4_4_ * auVar95._4_4_;
  auVar99._0_4_ = auVar81._0_4_ * auVar95._0_4_;
  auVar99._8_4_ = auVar81._8_4_ * auVar95._8_4_;
  auVar99._12_4_ = auVar81._12_4_ * auVar95._12_4_;
  auVar99._16_4_ = auVar95._16_4_ * 0.0;
  auVar99._20_4_ = auVar95._20_4_ * 0.0;
  auVar99._24_4_ = auVar95._24_4_ * 0.0;
  auVar99._28_4_ = auVar95._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx512vl(auVar94,auVar93);
  auVar106._0_4_ = auVar81._0_4_ * auVar94._0_4_;
  auVar106._4_4_ = auVar81._4_4_ * auVar94._4_4_;
  auVar106._8_4_ = auVar81._8_4_ * auVar94._8_4_;
  auVar106._12_4_ = auVar81._12_4_ * auVar94._12_4_;
  auVar106._16_4_ = auVar94._16_4_ * 0.0;
  auVar106._20_4_ = auVar94._20_4_ * 0.0;
  auVar106._24_4_ = auVar94._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar1 * 0x10 + 6));
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar1 * 0x10 + uVar77 * -2 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar83));
  auVar100._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar100._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar100._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar100._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar100._16_4_ = auVar94._16_4_ * 0.0;
  auVar100._20_4_ = auVar94._20_4_ * 0.0;
  auVar100._24_4_ = auVar94._24_4_ * 0.0;
  auVar100._28_4_ = auVar94._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar93);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar83));
  auVar104._0_4_ = auVar82._0_4_ * auVar94._0_4_;
  auVar104._4_4_ = auVar82._4_4_ * auVar94._4_4_;
  auVar104._8_4_ = auVar82._8_4_ * auVar94._8_4_;
  auVar104._12_4_ = auVar82._12_4_ * auVar94._12_4_;
  auVar104._16_4_ = auVar94._16_4_ * 0.0;
  auVar104._20_4_ = auVar94._20_4_ * 0.0;
  auVar104._24_4_ = auVar94._24_4_ * 0.0;
  auVar104._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 + uVar77 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar84));
  auVar101._4_4_ = auVar94._4_4_ * auVar79._4_4_;
  auVar101._0_4_ = auVar94._0_4_ * auVar79._0_4_;
  auVar101._8_4_ = auVar94._8_4_ * auVar79._8_4_;
  auVar101._12_4_ = auVar94._12_4_ * auVar79._12_4_;
  auVar101._16_4_ = auVar94._16_4_ * 0.0;
  auVar101._20_4_ = auVar94._20_4_ * 0.0;
  auVar101._24_4_ = auVar94._24_4_ * 0.0;
  auVar101._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar77 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar84));
  auVar90._0_4_ = auVar79._0_4_ * auVar94._0_4_;
  auVar90._4_4_ = auVar79._4_4_ * auVar94._4_4_;
  auVar90._8_4_ = auVar79._8_4_ * auVar94._8_4_;
  auVar90._12_4_ = auVar79._12_4_ * auVar94._12_4_;
  auVar90._16_4_ = auVar94._16_4_ * 0.0;
  auVar90._20_4_ = auVar94._20_4_ * 0.0;
  auVar90._24_4_ = auVar94._24_4_ * 0.0;
  auVar90._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar99,auVar106);
  auVar93 = vpminsd_avx2(auVar100,auVar104);
  auVar94 = vmaxps_avx(auVar94,auVar93);
  auVar93 = vpminsd_avx2(auVar101,auVar90);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar95._4_4_ = uVar142;
  auVar95._0_4_ = uVar142;
  auVar95._8_4_ = uVar142;
  auVar95._12_4_ = uVar142;
  auVar95._16_4_ = uVar142;
  auVar95._20_4_ = uVar142;
  auVar95._24_4_ = uVar142;
  auVar95._28_4_ = uVar142;
  auVar93 = vmaxps_avx512vl(auVar93,auVar95);
  auVar94 = vmaxps_avx(auVar94,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_2c0 = vmulps_avx512vl(auVar94,auVar93);
  auVar94 = vpmaxsd_avx2(auVar99,auVar106);
  auVar93 = vpmaxsd_avx2(auVar100,auVar104);
  auVar94 = vminps_avx(auVar94,auVar93);
  auVar93 = vpmaxsd_avx2(auVar101,auVar90);
  uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar96._4_4_ = uVar142;
  auVar96._0_4_ = uVar142;
  auVar96._8_4_ = uVar142;
  auVar96._12_4_ = uVar142;
  auVar96._16_4_ = uVar142;
  auVar96._20_4_ = uVar142;
  auVar96._24_4_ = uVar142;
  auVar96._28_4_ = uVar142;
  auVar93 = vminps_avx512vl(auVar93,auVar96);
  auVar94 = vminps_avx(auVar94,auVar93);
  auVar97._8_4_ = 0x3f800003;
  auVar97._0_8_ = 0x3f8000033f800003;
  auVar97._12_4_ = 0x3f800003;
  auVar97._16_4_ = 0x3f800003;
  auVar97._20_4_ = 0x3f800003;
  auVar97._24_4_ = 0x3f800003;
  auVar97._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar97);
  auVar93 = vpbroadcastd_avx512vl();
  uVar12 = vpcmpgtd_avx512vl(auVar93,_DAT_0205a920);
  uVar11 = vcmpps_avx512vl(local_2c0,auVar94,2);
  bVar75 = (byte)((byte)uVar11 & (byte)uVar12) == 0;
  bVar76 = !bVar75;
  if (bVar75) {
    return bVar76;
  }
  local_6d8 = (ulong)(byte)((byte)uVar11 & (byte)uVar12);
  local_4f0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_6e0 = prim;
LAB_01dacb58:
  lVar74 = 0;
  for (uVar70 = local_6d8; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
    lVar74 = lVar74 + 1;
  }
  local_8e8 = (ulong)*(uint *)(prim + 2);
  pGVar2 = (context->scene->geometries).items[local_8e8].ptr;
  uVar70 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar74 * 4 + 6));
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar74 = *(long *)&pGVar2[1].time_range.upper;
  auVar81 = *(undefined1 (*) [16])(lVar74 + (long)p_Var3 * uVar70);
  auVar82 = *(undefined1 (*) [16])(lVar74 + (uVar70 + 1) * (long)p_Var3);
  local_6d8 = local_6d8 - 1 & local_6d8;
  if (local_6d8 != 0) {
    uVar71 = local_6d8 - 1 & local_6d8;
    for (uVar77 = local_6d8; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    }
    if (uVar71 != 0) {
      for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar83 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_820 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  auVar253 = ZEXT3264(local_820);
  local_840 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar257 = ZEXT3264(local_840);
  auVar79 = vunpcklps_avx512vl(local_820._0_16_,local_840._0_16_);
  fVar226 = *(float *)(ray + k * 4 + 0x60);
  auVar242._4_4_ = fVar226;
  auVar242._0_4_ = fVar226;
  auVar242._8_4_ = fVar226;
  auVar242._12_4_ = fVar226;
  local_340._16_4_ = fVar226;
  local_340._0_16_ = auVar242;
  local_340._20_4_ = fVar226;
  local_340._24_4_ = fVar226;
  local_340._28_4_ = fVar226;
  auVar245 = ZEXT3264(local_340);
  local_690 = vinsertps_avx(auVar79,auVar242,0x28);
  auVar235 = ZEXT1664(local_690);
  auVar88._0_4_ = auVar81._0_4_ + auVar82._0_4_;
  auVar88._4_4_ = auVar81._4_4_ + auVar82._4_4_;
  auVar88._8_4_ = auVar81._8_4_ + auVar82._8_4_;
  auVar88._12_4_ = auVar81._12_4_ + auVar82._12_4_;
  auVar87._8_4_ = 0x3f000000;
  auVar87._0_8_ = 0x3f0000003f000000;
  auVar87._12_4_ = 0x3f000000;
  auVar79 = vmulps_avx512vl(auVar88,auVar87);
  auVar79 = vsubps_avx(auVar79,auVar83);
  auVar79 = vdpps_avx(auVar79,local_690,0x7f);
  fVar141 = *(float *)(ray + k * 4 + 0x30);
  local_6a0 = vdpps_avx(local_690,local_690,0x7f);
  auVar240 = ZEXT1664(local_6a0);
  auVar219._4_12_ = ZEXT812(0) << 0x20;
  auVar219._0_4_ = local_6a0._0_4_;
  auVar80 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar219);
  auVar84 = vfnmadd213ss_fma(auVar80,local_6a0,ZEXT416(0x40000000));
  local_240 = auVar79._0_4_ * auVar80._0_4_ * auVar84._0_4_;
  auVar220._4_4_ = local_240;
  auVar220._0_4_ = local_240;
  auVar220._8_4_ = local_240;
  auVar220._12_4_ = local_240;
  fStack_410 = local_240;
  _local_420 = auVar220;
  fStack_40c = local_240;
  fStack_408 = local_240;
  fStack_404 = local_240;
  auVar79 = vfmadd231ps_fma(auVar83,local_690,auVar220);
  auVar79 = vblendps_avx(auVar79,ZEXT816(0) << 0x40,8);
  auVar81 = vsubps_avx(auVar81,auVar79);
  auVar83 = vsubps_avx(*(undefined1 (*) [16])(lVar74 + (uVar70 + 2) * (long)p_Var3),auVar79);
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar232 = ZEXT1664(auVar82);
  auVar79 = vsubps_avx(*(undefined1 (*) [16])(lVar74 + (uVar70 + 3) * (long)p_Var3),auVar79);
  local_860 = vbroadcastss_avx512vl(auVar81);
  auVar246 = ZEXT3264(local_860);
  auVar112._8_4_ = 1;
  auVar112._0_8_ = 0x100000001;
  auVar112._12_4_ = 1;
  auVar112._16_4_ = 1;
  auVar112._20_4_ = 1;
  auVar112._24_4_ = 1;
  auVar112._28_4_ = 1;
  local_620 = ZEXT1632(auVar81);
  local_700 = vpermps_avx512vl(auVar112,local_620);
  auVar247 = ZEXT3264(local_700);
  auVar113._8_4_ = 2;
  auVar113._0_8_ = 0x200000002;
  auVar113._12_4_ = 2;
  auVar113._16_4_ = 2;
  auVar113._20_4_ = 2;
  auVar113._24_4_ = 2;
  auVar113._28_4_ = 2;
  local_720 = vpermps_avx512vl(auVar113,local_620);
  auVar248 = ZEXT3264(local_720);
  auVar114._8_4_ = 3;
  auVar114._0_8_ = 0x300000003;
  auVar114._12_4_ = 3;
  auVar114._16_4_ = 3;
  auVar114._20_4_ = 3;
  auVar114._24_4_ = 3;
  auVar114._28_4_ = 3;
  local_880 = vpermps_avx512vl(auVar114,local_620);
  auVar249 = ZEXT3264(local_880);
  local_740 = vbroadcastss_avx512vl(auVar82);
  auVar251 = ZEXT3264(local_740);
  local_660 = ZEXT1632(auVar82);
  local_8a0 = vpermps_avx512vl(auVar112,local_660);
  auVar250 = ZEXT3264(local_8a0);
  local_8c0 = vpermps_avx512vl(auVar113,local_660);
  auVar252 = ZEXT3264(local_8c0);
  local_760 = vpermps_avx512vl(auVar114,local_660);
  auVar254 = ZEXT3264(local_760);
  local_780 = vbroadcastss_avx512vl(auVar83);
  auVar256 = ZEXT3264(local_780);
  local_640 = ZEXT1632(auVar83);
  local_7a0 = vpermps_avx512vl(auVar112,local_640);
  auVar258 = ZEXT3264(local_7a0);
  local_260 = vpermps_avx2(auVar113,local_640);
  local_1e0 = vpermps_avx2(auVar114,local_640);
  local_280 = vbroadcastss_avx512vl(auVar79);
  _local_680 = ZEXT1632(auVar79);
  local_2a0 = vpermps_avx512vl(auVar112,_local_680);
  _local_560 = vpermps_avx2(auVar113,_local_680);
  _local_200 = vpermps_avx2(auVar114,_local_680);
  auVar94 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar226 * fVar226)),local_840,local_840);
  local_360 = vfmadd231ps_avx512vl(auVar94,local_820,local_820);
  uVar142 = local_360._0_4_;
  local_220._4_4_ = uVar142;
  local_220._0_4_ = uVar142;
  local_220._8_4_ = uVar142;
  local_220._12_4_ = uVar142;
  local_220._16_4_ = uVar142;
  local_220._20_4_ = uVar142;
  local_220._24_4_ = uVar142;
  local_220._28_4_ = uVar142;
  vandps_avx512vl(local_220,auVar255._0_32_);
  local_5d0 = ZEXT416((uint)local_240);
  local_240 = fVar141 - local_240;
  fStack_23c = local_240;
  fStack_238 = local_240;
  fStack_234 = local_240;
  fStack_230 = local_240;
  fStack_22c = local_240;
  fStack_228 = local_240;
  fStack_224 = local_240;
  local_4d0 = vpbroadcastd_avx512vl();
  local_8e0 = 1;
  uVar70 = 0;
  bVar72 = 0;
  local_4e0 = vpbroadcastd_avx512vl();
  auVar81 = vsqrtss_avx(local_6a0,local_6a0);
  local_8c4 = auVar81._0_4_;
  auVar81 = vsqrtss_avx(local_6a0,local_6a0);
  local_8c8 = auVar81._0_4_;
  local_5f0 = ZEXT816(0x3f80000000000000);
  auVar209 = ZEXT3264(_local_560);
  do {
    auVar81 = vmovshdup_avx(local_5f0);
    fVar221 = local_5f0._0_4_;
    fVar218 = auVar81._0_4_ - fVar221;
    fVar226 = fVar218 * 0.04761905;
    local_800._4_4_ = fVar221;
    local_800._0_4_ = fVar221;
    local_800._8_4_ = fVar221;
    local_800._12_4_ = fVar221;
    local_800._16_4_ = fVar221;
    local_800._20_4_ = fVar221;
    local_800._24_4_ = fVar221;
    local_800._28_4_ = fVar221;
    auVar152._4_4_ = fVar218;
    auVar152._0_4_ = fVar218;
    auVar152._8_4_ = fVar218;
    auVar152._12_4_ = fVar218;
    auVar152._16_4_ = fVar218;
    auVar152._20_4_ = fVar218;
    auVar152._24_4_ = fVar218;
    auVar152._28_4_ = fVar218;
    auVar81 = vfmadd231ps_fma(local_800,auVar152,_DAT_02020f20);
    auVar153._8_4_ = 0x3f800000;
    auVar153._0_8_ = &DAT_3f8000003f800000;
    auVar153._12_4_ = 0x3f800000;
    auVar153._16_4_ = 0x3f800000;
    auVar153._20_4_ = 0x3f800000;
    auVar153._24_4_ = 0x3f800000;
    auVar153._28_4_ = 0x3f800000;
    auVar94 = vsubps_avx(auVar153,ZEXT1632(auVar81));
    fVar218 = auVar81._0_4_;
    fVar221 = auVar81._4_4_;
    fVar222 = auVar81._8_4_;
    fVar223 = auVar81._12_4_;
    fVar224 = auVar94._0_4_;
    fVar225 = auVar94._4_4_;
    fVar198 = auVar94._8_4_;
    fVar229 = auVar94._12_4_;
    fVar227 = auVar94._16_4_;
    fVar143 = auVar94._20_4_;
    fVar230 = auVar94._24_4_;
    auVar34._4_4_ = fVar225 * fVar225 * -fVar221;
    auVar34._0_4_ = fVar224 * fVar224 * -fVar218;
    auVar34._8_4_ = fVar198 * fVar198 * -fVar222;
    auVar34._12_4_ = fVar229 * fVar229 * -fVar223;
    auVar34._16_4_ = fVar227 * fVar227 * -0.0;
    auVar34._20_4_ = fVar143 * fVar143 * -0.0;
    auVar34._24_4_ = fVar230 * fVar230 * -0.0;
    auVar34._28_4_ = 0x80000000;
    auVar255._28_36_ = auVar232._28_36_;
    auVar255._0_28_ =
         ZEXT1628(CONCAT412(fVar223 * fVar223,
                            CONCAT48(fVar222 * fVar222,CONCAT44(fVar221 * fVar221,fVar218 * fVar218)
                                    )));
    fVar233 = fVar218 * 3.0;
    fVar236 = fVar221 * 3.0;
    fVar237 = fVar222 * 3.0;
    fVar238 = fVar223 * 3.0;
    auVar232._28_36_ = auVar235._28_36_;
    auVar232._0_28_ = ZEXT1628(CONCAT412(fVar238,CONCAT48(fVar237,CONCAT44(fVar236,fVar233))));
    auVar178._0_4_ = fVar218 * fVar218 * (fVar233 + -5.0) + 2.0;
    auVar178._4_4_ = fVar221 * fVar221 * (fVar236 + -5.0) + 2.0;
    auVar178._8_4_ = fVar222 * fVar222 * (fVar237 + -5.0) + 2.0;
    auVar178._12_4_ = fVar223 * fVar223 * (fVar238 + -5.0) + 2.0;
    auVar178._16_4_ = 0x40000000;
    auVar178._20_4_ = 0x40000000;
    auVar178._24_4_ = 0x40000000;
    auVar178._28_4_ = 0x40000000;
    auVar241._0_4_ = fVar224 * fVar224;
    auVar241._4_4_ = fVar225 * fVar225;
    auVar241._8_4_ = fVar198 * fVar198;
    auVar241._12_4_ = fVar229 * fVar229;
    auVar241._16_4_ = fVar227 * fVar227;
    auVar241._20_4_ = fVar143 * fVar143;
    auVar241._28_36_ = auVar240._28_36_;
    auVar241._24_4_ = fVar230 * fVar230;
    auVar196._0_4_ = auVar241._0_4_ * (fVar224 * 3.0 + -5.0) + 2.0;
    auVar196._4_4_ = auVar241._4_4_ * (fVar225 * 3.0 + -5.0) + 2.0;
    auVar196._8_4_ = auVar241._8_4_ * (fVar198 * 3.0 + -5.0) + 2.0;
    auVar196._12_4_ = auVar241._12_4_ * (fVar229 * 3.0 + -5.0) + 2.0;
    auVar196._16_4_ = auVar241._16_4_ * (fVar227 * 3.0 + -5.0) + 2.0;
    auVar196._20_4_ = auVar241._20_4_ * (fVar143 * 3.0 + -5.0) + 2.0;
    auVar196._24_4_ = auVar241._24_4_ * (fVar230 * 3.0 + -5.0) + 2.0;
    auVar196._28_4_ = auVar245._28_4_ + -5.0 + 2.0;
    fVar231 = auVar94._28_4_;
    auVar35._4_4_ = fVar221 * fVar221 * -fVar225;
    auVar35._0_4_ = fVar218 * fVar218 * -fVar224;
    auVar35._8_4_ = fVar222 * fVar222 * -fVar198;
    auVar35._12_4_ = fVar223 * fVar223 * -fVar229;
    auVar35._16_4_ = -fVar227 * 0.0 * 0.0;
    auVar35._20_4_ = -fVar143 * 0.0 * 0.0;
    auVar35._24_4_ = -fVar230 * 0.0 * 0.0;
    auVar35._28_4_ = -fVar231;
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar94 = vmulps_avx512vl(auVar34,auVar96);
    auVar93 = vmulps_avx512vl(auVar178,auVar96);
    auVar95 = vmulps_avx512vl(auVar196,auVar96);
    auVar97 = vmulps_avx512vl(auVar35,auVar96);
    auVar98 = vmulps_avx512vl(local_280,auVar97);
    auVar99 = vmulps_avx512vl(local_2a0,auVar97);
    auVar36._4_4_ = auVar209._4_4_ * auVar97._4_4_;
    auVar36._0_4_ = auVar209._0_4_ * auVar97._0_4_;
    auVar36._8_4_ = auVar209._8_4_ * auVar97._8_4_;
    auVar36._12_4_ = auVar209._12_4_ * auVar97._12_4_;
    auVar36._16_4_ = auVar209._16_4_ * auVar97._16_4_;
    auVar36._20_4_ = auVar209._20_4_ * auVar97._20_4_;
    auVar36._24_4_ = auVar209._24_4_ * auVar97._24_4_;
    auVar36._28_4_ = 0x40000000;
    auVar37._4_4_ = (float)local_200._4_4_ * auVar97._4_4_;
    auVar37._0_4_ = (float)local_200._0_4_ * auVar97._0_4_;
    auVar37._8_4_ = fStack_1f8 * auVar97._8_4_;
    auVar37._12_4_ = fStack_1f4 * auVar97._12_4_;
    auVar37._16_4_ = fStack_1f0 * auVar97._16_4_;
    auVar37._20_4_ = fStack_1ec * auVar97._20_4_;
    auVar37._24_4_ = fStack_1e8 * auVar97._24_4_;
    auVar37._28_4_ = auVar97._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar256._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar95,auVar258._0_32_);
    auVar81 = vfmadd231ps_fma(auVar36,auVar95,local_260);
    auVar82 = vfmadd231ps_fma(auVar37,local_1e0,auVar95);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar93,auVar251._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar93,auVar250._0_32_);
    auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar93,auVar252._0_32_);
    auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar254._0_32_,auVar93);
    local_520 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar246._0_32_);
    local_7c0 = vfmadd231ps_avx512vl(auVar97,auVar94,auVar247._0_32_);
    auVar97 = vfmadd231ps_avx512vl(auVar98,auVar94,auVar248._0_32_);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar249._0_32_,auVar94);
    auVar38._4_4_ = (fVar225 + fVar225) * fVar221;
    auVar38._0_4_ = (fVar224 + fVar224) * fVar218;
    auVar38._8_4_ = (fVar198 + fVar198) * fVar222;
    auVar38._12_4_ = (fVar229 + fVar229) * fVar223;
    auVar38._16_4_ = (fVar227 + fVar227) * 0.0;
    auVar38._20_4_ = (fVar143 + fVar143) * 0.0;
    auVar38._24_4_ = (fVar230 + fVar230) * 0.0;
    auVar38._28_4_ = auVar93._28_4_;
    auVar94 = vsubps_avx(auVar38,auVar241._0_32_);
    auVar214._0_28_ =
         ZEXT1628(CONCAT412((fVar223 + fVar223) * (fVar238 + -5.0) + fVar238 * fVar223,
                            CONCAT48((fVar222 + fVar222) * (fVar237 + -5.0) + fVar237 * fVar222,
                                     CONCAT44((fVar221 + fVar221) * (fVar236 + -5.0) +
                                              fVar236 * fVar221,
                                              (fVar218 + fVar218) * (fVar233 + -5.0) +
                                              fVar233 * fVar218))));
    auVar214._28_4_ = auVar235._28_4_ + -5.0 + 0.0;
    auVar117._8_4_ = 0x40000000;
    auVar117._0_8_ = 0x4000000040000000;
    auVar117._12_4_ = 0x40000000;
    auVar117._16_4_ = 0x40000000;
    auVar117._20_4_ = 0x40000000;
    auVar117._24_4_ = 0x40000000;
    auVar117._28_4_ = 0x40000000;
    auVar93 = vaddps_avx512vl(auVar232._0_32_,auVar117);
    auVar39._4_4_ = (fVar225 + fVar225) * auVar93._4_4_;
    auVar39._0_4_ = (fVar224 + fVar224) * auVar93._0_4_;
    auVar39._8_4_ = (fVar198 + fVar198) * auVar93._8_4_;
    auVar39._12_4_ = (fVar229 + fVar229) * auVar93._12_4_;
    auVar39._16_4_ = (fVar227 + fVar227) * auVar93._16_4_;
    auVar39._20_4_ = (fVar143 + fVar143) * auVar93._20_4_;
    auVar39._24_4_ = (fVar230 + fVar230) * auVar93._24_4_;
    auVar39._28_4_ = auVar93._28_4_;
    auVar40._4_4_ = fVar225 * 3.0 * fVar225;
    auVar40._0_4_ = fVar224 * 3.0 * fVar224;
    auVar40._8_4_ = fVar198 * 3.0 * fVar198;
    auVar40._12_4_ = fVar229 * 3.0 * fVar229;
    auVar40._16_4_ = fVar227 * 3.0 * fVar227;
    auVar40._20_4_ = fVar143 * 3.0 * fVar143;
    auVar40._24_4_ = fVar230 * 3.0 * fVar230;
    auVar40._28_4_ = fVar231;
    auVar93 = vsubps_avx(auVar39,auVar40);
    auVar95 = vsubps_avx(auVar255._0_32_,auVar38);
    auVar99 = vmulps_avx512vl(auVar94,auVar96);
    auVar100 = vmulps_avx512vl(auVar214,auVar96);
    auVar93 = vmulps_avx512vl(auVar93,auVar96);
    auVar95 = vmulps_avx512vl(auVar95,auVar96);
    auVar96 = vmulps_avx512vl(local_280,auVar95);
    auVar101 = vmulps_avx512vl(local_2a0,auVar95);
    auVar41._4_4_ = auVar95._4_4_ * (float)local_560._4_4_;
    auVar41._0_4_ = auVar95._0_4_ * (float)local_560._0_4_;
    auVar41._8_4_ = auVar95._8_4_ * fStack_558;
    auVar41._12_4_ = auVar95._12_4_ * fStack_554;
    auVar41._16_4_ = auVar95._16_4_ * fStack_550;
    auVar41._20_4_ = auVar95._20_4_ * fStack_54c;
    auVar41._24_4_ = auVar95._24_4_ * fStack_548;
    auVar41._28_4_ = fVar231 + fVar231;
    auVar42._4_4_ = auVar95._4_4_ * (float)local_200._4_4_;
    auVar42._0_4_ = auVar95._0_4_ * (float)local_200._0_4_;
    auVar42._8_4_ = auVar95._8_4_ * fStack_1f8;
    auVar42._12_4_ = auVar95._12_4_ * fStack_1f4;
    auVar42._16_4_ = auVar95._16_4_ * fStack_1f0;
    auVar42._20_4_ = auVar95._20_4_ * fStack_1ec;
    auVar42._24_4_ = auVar95._24_4_ * fStack_1e8;
    auVar42._28_4_ = auVar95._28_4_;
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar93,auVar256._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar101,auVar93,auVar258._0_32_);
    auVar81 = vfmadd231ps_fma(auVar41,auVar93,local_260);
    auVar82 = vfmadd231ps_fma(auVar42,local_1e0,auVar93);
    auVar93 = vfmadd231ps_avx512vl(auVar95,auVar100,auVar251._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar100,auVar250._0_32_);
    auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar100,auVar252._0_32_);
    auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar82),auVar254._0_32_,auVar100);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,auVar246._0_32_);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar99,auVar247._0_32_);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,auVar248._0_32_);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar249._0_32_,auVar99);
    auVar43._4_4_ = auVar93._4_4_ * fVar226;
    auVar43._0_4_ = auVar93._0_4_ * fVar226;
    auVar43._8_4_ = auVar93._8_4_ * fVar226;
    auVar43._12_4_ = auVar93._12_4_ * fVar226;
    auVar43._16_4_ = auVar93._16_4_ * fVar226;
    auVar43._20_4_ = auVar93._20_4_ * fVar226;
    auVar43._24_4_ = auVar93._24_4_ * fVar226;
    auVar43._28_4_ = auVar94._28_4_;
    auVar240 = ZEXT3264(auVar43);
    auVar44._4_4_ = auVar95._4_4_ * fVar226;
    auVar44._0_4_ = auVar95._0_4_ * fVar226;
    auVar44._8_4_ = auVar95._8_4_ * fVar226;
    auVar44._12_4_ = auVar95._12_4_ * fVar226;
    auVar44._16_4_ = auVar95._16_4_ * fVar226;
    auVar44._20_4_ = auVar95._20_4_ * fVar226;
    auVar44._24_4_ = auVar95._24_4_ * fVar226;
    auVar44._28_4_ = auVar95._28_4_;
    auVar245 = ZEXT3264(auVar44);
    auVar45._4_4_ = auVar96._4_4_ * fVar226;
    auVar45._0_4_ = auVar96._0_4_ * fVar226;
    auVar45._8_4_ = auVar96._8_4_ * fVar226;
    auVar45._12_4_ = auVar96._12_4_ * fVar226;
    auVar45._16_4_ = auVar96._16_4_ * fVar226;
    auVar45._20_4_ = auVar96._20_4_ * fVar226;
    auVar45._24_4_ = auVar96._24_4_ * fVar226;
    auVar45._28_4_ = auVar96._28_4_;
    fVar218 = auVar99._0_4_ * fVar226;
    fVar221 = auVar99._4_4_ * fVar226;
    auVar46._4_4_ = fVar221;
    auVar46._0_4_ = fVar218;
    fVar222 = auVar99._8_4_ * fVar226;
    auVar46._8_4_ = fVar222;
    fVar223 = auVar99._12_4_ * fVar226;
    auVar46._12_4_ = fVar223;
    fVar224 = auVar99._16_4_ * fVar226;
    auVar46._16_4_ = fVar224;
    fVar225 = auVar99._20_4_ * fVar226;
    auVar46._20_4_ = fVar225;
    fVar226 = auVar99._24_4_ * fVar226;
    auVar46._24_4_ = fVar226;
    auVar46._28_4_ = local_1e0._28_4_;
    auVar81 = vxorps_avx512vl(auVar258._0_16_,auVar258._0_16_);
    auVar96 = vpermt2ps_avx512vl(local_520,_DAT_0205fd20,ZEXT1632(auVar81));
    auVar232 = ZEXT3264(auVar96);
    auVar99 = vpermt2ps_avx512vl(local_7c0,_DAT_0205fd20,ZEXT1632(auVar81));
    auVar235 = ZEXT3264(auVar99);
    auVar95 = ZEXT1632(auVar81);
    auVar100 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar95);
    auVar215._0_4_ = auVar98._0_4_ + fVar218;
    auVar215._4_4_ = auVar98._4_4_ + fVar221;
    auVar215._8_4_ = auVar98._8_4_ + fVar222;
    auVar215._12_4_ = auVar98._12_4_ + fVar223;
    auVar215._16_4_ = auVar98._16_4_ + fVar224;
    auVar215._20_4_ = auVar98._20_4_ + fVar225;
    auVar215._24_4_ = auVar98._24_4_ + fVar226;
    auVar215._28_4_ = auVar98._28_4_ + local_1e0._28_4_;
    auVar94 = vmaxps_avx(auVar98,auVar215);
    auVar93 = vminps_avx(auVar98,auVar215);
    auVar98 = vpermt2ps_avx512vl(auVar98,_DAT_0205fd20,auVar95);
    auVar101 = vpermt2ps_avx512vl(auVar43,_DAT_0205fd20,auVar95);
    auVar102 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar95);
    auVar113 = ZEXT1632(auVar81);
    auVar91 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar113);
    auVar95 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar113);
    auVar92 = vsubps_avx512vl(auVar98,auVar95);
    auVar103 = vsubps_avx512vl(auVar96,local_520);
    auVar95 = vsubps_avx(auVar99,local_7c0);
    local_7e0 = vsubps_avx512vl(auVar100,auVar97);
    auVar89 = vmulps_avx512vl(auVar95,auVar45);
    auVar89 = vfmsub231ps_avx512vl(auVar89,auVar44,local_7e0);
    auVar90 = vmulps_avx512vl(local_7e0,auVar43);
    auVar90 = vfmsub231ps_avx512vl(auVar90,auVar45,auVar103);
    auVar104 = vmulps_avx512vl(auVar103,auVar44);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar43,auVar95);
    auVar104 = vmulps_avx512vl(auVar104,auVar104);
    auVar90 = vfmadd231ps_avx512vl(auVar104,auVar90,auVar90);
    auVar89 = vfmadd231ps_avx512vl(auVar90,auVar89,auVar89);
    auVar90 = vmulps_avx512vl(local_7e0,local_7e0);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar95,auVar95);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar103,auVar103);
    auVar104 = vrcp14ps_avx512vl(auVar90);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = &DAT_3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar118._16_4_ = 0x3f800000;
    auVar118._20_4_ = 0x3f800000;
    auVar118._24_4_ = 0x3f800000;
    auVar118._28_4_ = 0x3f800000;
    auVar105 = vfnmadd213ps_avx512vl(auVar104,auVar90,auVar118);
    auVar104 = vfmadd132ps_avx512vl(auVar105,auVar104,auVar104);
    auVar89 = vmulps_avx512vl(auVar89,auVar104);
    auVar105 = vmulps_avx512vl(auVar95,auVar91);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar102,local_7e0);
    auVar106 = vmulps_avx512vl(local_7e0,auVar101);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar91,auVar103);
    auVar107 = vmulps_avx512vl(auVar103,auVar102);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar101,auVar95);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vmulps_avx512vl(auVar105,auVar104);
    auVar89 = vmaxps_avx512vl(auVar89,auVar104);
    auVar89 = vsqrtps_avx512vl(auVar89);
    auVar104 = vmaxps_avx512vl(auVar92,auVar98);
    auVar94 = vmaxps_avx512vl(auVar94,auVar104);
    auVar104 = vaddps_avx512vl(auVar89,auVar94);
    auVar94 = vminps_avx512vl(auVar92,auVar98);
    auVar94 = vminps_avx(auVar93,auVar94);
    auVar94 = vsubps_avx512vl(auVar94,auVar89);
    auVar119._8_4_ = 0x3f800002;
    auVar119._0_8_ = 0x3f8000023f800002;
    auVar119._12_4_ = 0x3f800002;
    auVar119._16_4_ = 0x3f800002;
    auVar119._20_4_ = 0x3f800002;
    auVar119._24_4_ = 0x3f800002;
    auVar119._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar104,auVar119);
    auVar120._8_4_ = 0x3f7ffffc;
    auVar120._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar120._12_4_ = 0x3f7ffffc;
    auVar120._16_4_ = 0x3f7ffffc;
    auVar120._20_4_ = 0x3f7ffffc;
    auVar120._24_4_ = 0x3f7ffffc;
    auVar120._28_4_ = 0x3f7ffffc;
    auVar98 = vmulps_avx512vl(auVar94,auVar120);
    auVar47._4_4_ = auVar93._4_4_ * auVar93._4_4_;
    auVar47._0_4_ = auVar93._0_4_ * auVar93._0_4_;
    auVar47._8_4_ = auVar93._8_4_ * auVar93._8_4_;
    auVar47._12_4_ = auVar93._12_4_ * auVar93._12_4_;
    auVar47._16_4_ = auVar93._16_4_ * auVar93._16_4_;
    auVar47._20_4_ = auVar93._20_4_ * auVar93._20_4_;
    auVar47._24_4_ = auVar93._24_4_ * auVar93._24_4_;
    auVar47._28_4_ = auVar98._28_4_;
    auVar94 = vrsqrt14ps_avx512vl(auVar90);
    auVar19._8_4_ = 0xbf000000;
    auVar19._0_8_ = 0xbf000000bf000000;
    auVar19._12_4_ = 0xbf000000;
    auVar19._16_4_ = 0xbf000000;
    auVar19._20_4_ = 0xbf000000;
    auVar19._24_4_ = 0xbf000000;
    auVar19._28_4_ = 0xbf000000;
    auVar93 = vmulps_avx512vl(auVar90,auVar19);
    auVar48._4_4_ = auVar94._4_4_ * auVar93._4_4_;
    auVar48._0_4_ = auVar94._0_4_ * auVar93._0_4_;
    auVar48._8_4_ = auVar94._8_4_ * auVar93._8_4_;
    auVar48._12_4_ = auVar94._12_4_ * auVar93._12_4_;
    auVar48._16_4_ = auVar94._16_4_ * auVar93._16_4_;
    auVar48._20_4_ = auVar94._20_4_ * auVar93._20_4_;
    auVar48._24_4_ = auVar94._24_4_ * auVar93._24_4_;
    auVar48._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar94,auVar94);
    auVar93 = vmulps_avx512vl(auVar93,auVar48);
    auVar20._8_4_ = 0x3fc00000;
    auVar20._0_8_ = 0x3fc000003fc00000;
    auVar20._12_4_ = 0x3fc00000;
    auVar20._16_4_ = 0x3fc00000;
    auVar20._20_4_ = 0x3fc00000;
    auVar20._24_4_ = 0x3fc00000;
    auVar20._28_4_ = 0x3fc00000;
    auVar92 = vfmadd231ps_avx512vl(auVar93,auVar94,auVar20);
    auVar49._4_4_ = auVar92._4_4_ * auVar103._4_4_;
    auVar49._0_4_ = auVar92._0_4_ * auVar103._0_4_;
    auVar49._8_4_ = auVar92._8_4_ * auVar103._8_4_;
    auVar49._12_4_ = auVar92._12_4_ * auVar103._12_4_;
    auVar49._16_4_ = auVar92._16_4_ * auVar103._16_4_;
    auVar49._20_4_ = auVar92._20_4_ * auVar103._20_4_;
    auVar49._24_4_ = auVar92._24_4_ * auVar103._24_4_;
    auVar49._28_4_ = auVar94._28_4_;
    auVar94 = vmulps_avx512vl(auVar95,auVar92);
    auVar93 = vmulps_avx512vl(local_7e0,auVar92);
    auVar89 = vsubps_avx512vl(auVar113,local_520);
    auVar90 = vsubps_avx512vl(auVar113,local_7c0);
    auVar104 = vsubps_avx512vl(auVar113,auVar97);
    auVar105 = vmulps_avx512vl(local_340,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar257._0_32_,auVar90);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar253._0_32_,auVar89);
    auVar106 = vmulps_avx512vl(auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar90,auVar90);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar89,auVar89);
    auVar107 = vmulps_avx512vl(local_340,auVar93);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar94,auVar257._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar49,auVar253._0_32_);
    auVar93 = vmulps_avx512vl(auVar104,auVar93);
    auVar94 = vfmadd231ps_avx512vl(auVar93,auVar90,auVar94);
    auVar108 = vfmadd231ps_avx512vl(auVar94,auVar89,auVar49);
    auVar109 = vmulps_avx512vl(auVar107,auVar107);
    auVar94 = vsubps_avx(local_220,auVar109);
    auVar93 = vmulps_avx512vl(auVar107,auVar108);
    auVar93 = vsubps_avx512vl(auVar105,auVar93);
    auVar105 = vaddps_avx512vl(auVar93,auVar93);
    auVar93 = vmulps_avx512vl(auVar108,auVar108);
    auVar106 = vsubps_avx512vl(auVar106,auVar93);
    auVar93 = vsubps_avx(auVar106,auVar47);
    auVar110 = vmulps_avx512vl(auVar105,auVar105);
    auVar21._8_4_ = 0x40800000;
    auVar21._0_8_ = 0x4080000040800000;
    auVar21._12_4_ = 0x40800000;
    auVar21._16_4_ = 0x40800000;
    auVar21._20_4_ = 0x40800000;
    auVar21._24_4_ = 0x40800000;
    auVar21._28_4_ = 0x40800000;
    auVar111 = vmulps_avx512vl(auVar94,auVar21);
    auVar112 = vmulps_avx512vl(auVar111,auVar93);
    auVar112 = vsubps_avx512vl(auVar110,auVar112);
    uVar77 = vcmpps_avx512vl(auVar112,auVar113,5);
    bVar67 = (byte)uVar77;
    if (bVar67 == 0) {
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar112 = vsqrtps_avx512vl(auVar112);
      auVar113 = vaddps_avx512vl(auVar94,auVar94);
      auVar114 = vrcp14ps_avx512vl(auVar113);
      auVar22._8_4_ = 0x3f800000;
      auVar22._0_8_ = &DAT_3f8000003f800000;
      auVar22._12_4_ = 0x3f800000;
      auVar22._16_4_ = 0x3f800000;
      auVar22._20_4_ = 0x3f800000;
      auVar22._24_4_ = 0x3f800000;
      auVar22._28_4_ = 0x3f800000;
      auVar113 = vfnmadd213ps_avx512vl(auVar113,auVar114,auVar22);
      auVar113 = vfmadd132ps_avx512vl(auVar113,auVar114,auVar114);
      auVar23._8_4_ = 0x80000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar23._12_4_ = 0x80000000;
      auVar23._16_4_ = 0x80000000;
      auVar23._20_4_ = 0x80000000;
      auVar23._24_4_ = 0x80000000;
      auVar23._28_4_ = 0x80000000;
      auVar114 = vxorps_avx512vl(auVar105,auVar23);
      auVar114 = vsubps_avx512vl(auVar114,auVar112);
      auVar114 = vmulps_avx512vl(auVar114,auVar113);
      auVar112 = vsubps_avx512vl(auVar112,auVar105);
      auVar112 = vmulps_avx512vl(auVar112,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar114,auVar108);
      local_3a0 = vmulps_avx512vl(auVar92,auVar113);
      auVar113 = vfmadd213ps_avx512vl(auVar107,auVar112,auVar108);
      local_3c0 = vmulps_avx512vl(auVar92,auVar113);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vblendmps_avx512vl(auVar113,auVar114);
      auVar115._0_4_ =
           (uint)(bVar67 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar67 & 1) * local_3c0._0_4_;
      bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar75 * auVar113._4_4_ | (uint)!bVar75 * local_3c0._4_4_;
      bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar75 * auVar113._8_4_ | (uint)!bVar75 * local_3c0._8_4_;
      bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar75 * auVar113._12_4_ | (uint)!bVar75 * local_3c0._12_4_;
      bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar115._16_4_ = (uint)bVar75 * auVar113._16_4_ | (uint)!bVar75 * local_3c0._16_4_;
      bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar115._20_4_ = (uint)bVar75 * auVar113._20_4_ | (uint)!bVar75 * local_3c0._20_4_;
      bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar115._24_4_ = (uint)bVar75 * auVar113._24_4_ | (uint)!bVar75 * local_3c0._24_4_;
      bVar75 = SUB81(uVar77 >> 7,0);
      auVar115._28_4_ = (uint)bVar75 * auVar113._28_4_ | (uint)!bVar75 * local_3c0._28_4_;
      auVar205._8_4_ = 0xff800000;
      auVar205._0_8_ = 0xff800000ff800000;
      auVar205._12_4_ = 0xff800000;
      auVar205._16_4_ = 0xff800000;
      auVar205._20_4_ = 0xff800000;
      auVar205._24_4_ = 0xff800000;
      auVar205._28_4_ = 0xff800000;
      auVar113 = vblendmps_avx512vl(auVar205,auVar112);
      auVar116._0_4_ =
           (uint)(bVar67 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar112._0_4_;
      bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar75 * auVar113._4_4_ | (uint)!bVar75 * auVar112._4_4_;
      bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar75 * auVar113._8_4_ | (uint)!bVar75 * auVar112._8_4_;
      bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar75 * auVar113._12_4_ | (uint)!bVar75 * auVar112._12_4_;
      bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar75 * auVar113._16_4_ | (uint)!bVar75 * auVar112._16_4_;
      bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar75 * auVar113._20_4_ | (uint)!bVar75 * auVar112._20_4_;
      bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar75 * auVar113._24_4_ | (uint)!bVar75 * auVar112._24_4_;
      bVar75 = SUB81(uVar77 >> 7,0);
      auVar116._28_4_ = (uint)bVar75 * auVar113._28_4_ | (uint)!bVar75 * auVar112._28_4_;
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar112);
      auVar113 = vmaxps_avx512vl(local_360,auVar112);
      auVar24._8_4_ = 0x36000000;
      auVar24._0_8_ = 0x3600000036000000;
      auVar24._12_4_ = 0x36000000;
      auVar24._16_4_ = 0x36000000;
      auVar24._20_4_ = 0x36000000;
      auVar24._24_4_ = 0x36000000;
      auVar24._28_4_ = 0x36000000;
      auVar113 = vmulps_avx512vl(auVar113,auVar24);
      vandps_avx512vl(auVar94,auVar112);
      uVar71 = vcmpps_avx512vl(auVar113,auVar113,1);
      uVar77 = uVar77 & uVar71;
      bVar73 = (byte)uVar77;
      if (bVar73 != 0) {
        uVar71 = vcmpps_avx512vl(auVar93,_DAT_02020f00,2);
        auVar217._8_4_ = 0xff800000;
        auVar217._0_8_ = 0xff800000ff800000;
        auVar217._12_4_ = 0xff800000;
        auVar217._16_4_ = 0xff800000;
        auVar217._20_4_ = 0xff800000;
        auVar217._24_4_ = 0xff800000;
        auVar217._28_4_ = 0xff800000;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar112 = vblendmps_avx512vl(auVar93,auVar217);
        bVar69 = (byte)uVar71;
        uVar78 = (uint)(bVar69 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar69 & 1) * auVar113._0_4_;
        bVar75 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar134 = (uint)bVar75 * auVar112._4_4_ | (uint)!bVar75 * auVar113._4_4_;
        bVar75 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar135 = (uint)bVar75 * auVar112._8_4_ | (uint)!bVar75 * auVar113._8_4_;
        bVar75 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar136 = (uint)bVar75 * auVar112._12_4_ | (uint)!bVar75 * auVar113._12_4_;
        bVar75 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar137 = (uint)bVar75 * auVar112._16_4_ | (uint)!bVar75 * auVar113._16_4_;
        bVar75 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar138 = (uint)bVar75 * auVar112._20_4_ | (uint)!bVar75 * auVar113._20_4_;
        bVar75 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar139 = (uint)bVar75 * auVar112._24_4_ | (uint)!bVar75 * auVar113._24_4_;
        bVar75 = SUB81(uVar71 >> 7,0);
        uVar140 = (uint)bVar75 * auVar112._28_4_ | (uint)!bVar75 * auVar113._28_4_;
        auVar115._0_4_ = (bVar73 & 1) * uVar78 | !(bool)(bVar73 & 1) * auVar115._0_4_;
        bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar115._4_4_ = bVar75 * uVar134 | !bVar75 * auVar115._4_4_;
        bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar115._8_4_ = bVar75 * uVar135 | !bVar75 * auVar115._8_4_;
        bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar115._12_4_ = bVar75 * uVar136 | !bVar75 * auVar115._12_4_;
        bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar115._16_4_ = bVar75 * uVar137 | !bVar75 * auVar115._16_4_;
        bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar115._20_4_ = bVar75 * uVar138 | !bVar75 * auVar115._20_4_;
        bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar115._24_4_ = bVar75 * uVar139 | !bVar75 * auVar115._24_4_;
        bVar75 = SUB81(uVar77 >> 7,0);
        auVar115._28_4_ = bVar75 * uVar140 | !bVar75 * auVar115._28_4_;
        auVar93 = vblendmps_avx512vl(auVar217,auVar93);
        bVar75 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar10 = SUB81(uVar71 >> 7,0);
        auVar116._0_4_ =
             (uint)(bVar73 & 1) *
             ((uint)(bVar69 & 1) * auVar93._0_4_ | !(bool)(bVar69 & 1) * uVar78) |
             !(bool)(bVar73 & 1) * auVar116._0_4_;
        bVar4 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar116._4_4_ =
             (uint)bVar4 * ((uint)bVar75 * auVar93._4_4_ | !bVar75 * uVar134) |
             !bVar4 * auVar116._4_4_;
        bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar116._8_4_ =
             (uint)bVar75 * ((uint)bVar5 * auVar93._8_4_ | !bVar5 * uVar135) |
             !bVar75 * auVar116._8_4_;
        bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar116._12_4_ =
             (uint)bVar75 * ((uint)bVar6 * auVar93._12_4_ | !bVar6 * uVar136) |
             !bVar75 * auVar116._12_4_;
        bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar116._16_4_ =
             (uint)bVar75 * ((uint)bVar7 * auVar93._16_4_ | !bVar7 * uVar137) |
             !bVar75 * auVar116._16_4_;
        bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar116._20_4_ =
             (uint)bVar75 * ((uint)bVar8 * auVar93._20_4_ | !bVar8 * uVar138) |
             !bVar75 * auVar116._20_4_;
        bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar116._24_4_ =
             (uint)bVar75 * ((uint)bVar9 * auVar93._24_4_ | !bVar9 * uVar139) |
             !bVar75 * auVar116._24_4_;
        bVar75 = SUB81(uVar77 >> 7,0);
        auVar116._28_4_ =
             (uint)bVar75 * ((uint)bVar10 * auVar93._28_4_ | !bVar10 * uVar140) |
             !bVar75 * auVar116._28_4_;
        bVar67 = (~bVar73 | bVar69) & bVar67;
      }
    }
    auVar154._8_4_ = 0x3f800000;
    auVar154._0_8_ = &DAT_3f8000003f800000;
    auVar154._12_4_ = 0x3f800000;
    auVar154._16_4_ = 0x3f800000;
    auVar154._20_4_ = 0x3f800000;
    auVar154._24_4_ = 0x3f800000;
    auVar154._28_4_ = 0x3f800000;
    auVar209 = ZEXT3264(_local_560);
    if ((bVar67 & 0x7f) == 0) {
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar255 = ZEXT3264(auVar94);
      auVar253 = ZEXT3264(local_820);
      auVar257 = ZEXT3264(local_840);
      auVar246 = ZEXT3264(local_860);
      auVar247 = ZEXT3264(local_700);
      auVar248 = ZEXT3264(local_720);
      auVar249 = ZEXT3264(local_880);
      auVar251 = ZEXT3264(local_740);
      auVar250 = ZEXT3264(local_8a0);
      auVar252 = ZEXT3264(local_8c0);
      auVar254 = ZEXT3264(local_760);
      auVar256 = ZEXT3264(local_780);
      auVar258 = ZEXT3264(local_7a0);
    }
    else {
      fVar226 = *(float *)(ray + k * 4 + 0x80) - (float)local_5d0._0_4_;
      auVar206._4_4_ = fVar226;
      auVar206._0_4_ = fVar226;
      auVar206._8_4_ = fVar226;
      auVar206._12_4_ = fVar226;
      auVar206._16_4_ = fVar226;
      auVar206._20_4_ = fVar226;
      auVar206._24_4_ = fVar226;
      auVar206._28_4_ = fVar226;
      auVar112 = vminps_avx512vl(auVar206,auVar116);
      auVar66._4_4_ = fStack_23c;
      auVar66._0_4_ = local_240;
      auVar66._8_4_ = fStack_238;
      auVar66._12_4_ = fStack_234;
      auVar66._16_4_ = fStack_230;
      auVar66._20_4_ = fStack_22c;
      auVar66._24_4_ = fStack_228;
      auVar66._28_4_ = fStack_224;
      auVar93 = vmaxps_avx512vl(auVar66,auVar115);
      auVar104 = vmulps_avx512vl(auVar104,auVar45);
      auVar90 = vfmadd213ps_avx512vl(auVar90,auVar44,auVar104);
      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar43,auVar90);
      auVar90 = vmulps_avx512vl(local_340,auVar45);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_840,auVar44);
      auVar90 = vfmadd231ps_avx512vl(auVar90,local_820,auVar43);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar255 = ZEXT3264(auVar104);
      vandps_avx512vl(auVar90,auVar104);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar11 = vcmpps_avx512vl(auVar104,auVar113,1);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar89 = vxorps_avx512vl(auVar89,auVar114);
      auVar117 = vrcp14ps_avx512vl(auVar90);
      auVar118 = vxorps_avx512vl(auVar90,auVar114);
      auVar119 = vfnmadd213ps_avx512vl(auVar117,auVar90,auVar154);
      auVar119 = vfmadd132ps_avx512vl(auVar119,auVar117,auVar117);
      auVar89 = vmulps_avx512vl(auVar119,auVar89);
      uVar12 = vcmpps_avx512vl(auVar90,auVar118,1);
      bVar73 = (byte)uVar11 | (byte)uVar12;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar120 = vblendmps_avx512vl(auVar89,auVar119);
      auVar121._0_4_ =
           (uint)(bVar73 & 1) * auVar120._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar117._0_4_;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar121._4_4_ = (uint)bVar75 * auVar120._4_4_ | (uint)!bVar75 * auVar117._4_4_;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar121._8_4_ = (uint)bVar75 * auVar120._8_4_ | (uint)!bVar75 * auVar117._8_4_;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar121._12_4_ = (uint)bVar75 * auVar120._12_4_ | (uint)!bVar75 * auVar117._12_4_;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar121._16_4_ = (uint)bVar75 * auVar120._16_4_ | (uint)!bVar75 * auVar117._16_4_;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar121._20_4_ = (uint)bVar75 * auVar120._20_4_ | (uint)!bVar75 * auVar117._20_4_;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar121._24_4_ = (uint)bVar75 * auVar120._24_4_ | (uint)!bVar75 * auVar117._24_4_;
      auVar121._28_4_ =
           (uint)(bVar73 >> 7) * auVar120._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar117._28_4_;
      auVar93 = vmaxps_avx(auVar93,auVar121);
      uVar12 = vcmpps_avx512vl(auVar90,auVar118,6);
      bVar73 = (byte)uVar11 | (byte)uVar12;
      auVar122._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * auVar89._0_4_;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar122._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar89._4_4_;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar122._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar89._8_4_;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar122._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar89._12_4_;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar122._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar89._16_4_;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar122._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar89._20_4_;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar122._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * auVar89._24_4_;
      auVar122._28_4_ =
           (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar89._28_4_;
      auVar89 = vminps_avx(auVar112,auVar122);
      auVar81 = vxorps_avx512vl(auVar118._0_16_,auVar118._0_16_);
      auVar96 = vsubps_avx512vl(ZEXT1632(auVar81),auVar96);
      auVar99 = vsubps_avx512vl(ZEXT1632(auVar81),auVar99);
      auVar90 = ZEXT1632(auVar81);
      auVar100 = vsubps_avx512vl(auVar90,auVar100);
      auVar50._4_4_ = auVar100._4_4_ * auVar91._4_4_;
      auVar50._0_4_ = auVar100._0_4_ * auVar91._0_4_;
      auVar50._8_4_ = auVar100._8_4_ * auVar91._8_4_;
      auVar50._12_4_ = auVar100._12_4_ * auVar91._12_4_;
      auVar50._16_4_ = auVar100._16_4_ * auVar91._16_4_;
      auVar50._20_4_ = auVar100._20_4_ * auVar91._20_4_;
      auVar50._24_4_ = auVar100._24_4_ * auVar91._24_4_;
      auVar50._28_4_ = auVar100._28_4_;
      auVar99 = vfnmsub231ps_avx512vl(auVar50,auVar102,auVar99);
      auVar96 = vfnmadd231ps_avx512vl(auVar99,auVar101,auVar96);
      auVar99 = vmulps_avx512vl(local_340,auVar91);
      auVar99 = vfnmsub231ps_avx512vl(auVar99,local_840,auVar102);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,local_820,auVar101);
      vandps_avx512vl(auVar99,auVar104);
      uVar11 = vcmpps_avx512vl(auVar99,auVar113,1);
      auVar96 = vxorps_avx512vl(auVar96,auVar114);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar101 = vxorps_avx512vl(auVar99,auVar114);
      auVar240 = ZEXT3264(auVar101);
      auVar81 = vfnmadd213ps_fma(auVar100,auVar99,auVar154);
      auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar100,auVar100);
      auVar245 = ZEXT1664(auVar81);
      fVar226 = auVar81._0_4_ * auVar96._0_4_;
      fVar218 = auVar81._4_4_ * auVar96._4_4_;
      auVar51._4_4_ = fVar218;
      auVar51._0_4_ = fVar226;
      fVar221 = auVar81._8_4_ * auVar96._8_4_;
      auVar51._8_4_ = fVar221;
      fVar222 = auVar81._12_4_ * auVar96._12_4_;
      auVar51._12_4_ = fVar222;
      fVar223 = auVar96._16_4_ * 0.0;
      auVar51._16_4_ = fVar223;
      fVar224 = auVar96._20_4_ * 0.0;
      auVar51._20_4_ = fVar224;
      fVar225 = auVar96._24_4_ * 0.0;
      auVar51._24_4_ = fVar225;
      auVar51._28_4_ = auVar96._28_4_;
      uVar12 = vcmpps_avx512vl(auVar99,auVar101,1);
      bVar73 = (byte)uVar11 | (byte)uVar12;
      auVar102 = vblendmps_avx512vl(auVar51,auVar119);
      auVar123._0_4_ =
           (uint)(bVar73 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar100._0_4_;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar75 * auVar102._4_4_ | (uint)!bVar75 * auVar100._4_4_;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar75 * auVar102._8_4_ | (uint)!bVar75 * auVar100._8_4_;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar75 * auVar102._12_4_ | (uint)!bVar75 * auVar100._12_4_;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar75 * auVar102._16_4_ | (uint)!bVar75 * auVar100._16_4_;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar75 * auVar102._20_4_ | (uint)!bVar75 * auVar100._20_4_;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar75 * auVar102._24_4_ | (uint)!bVar75 * auVar100._24_4_;
      auVar123._28_4_ =
           (uint)(bVar73 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar100._28_4_;
      _local_540 = vmaxps_avx(auVar93,auVar123);
      uVar12 = vcmpps_avx512vl(auVar99,auVar101,6);
      bVar73 = (byte)uVar11 | (byte)uVar12;
      auVar124._0_4_ = (uint)(bVar73 & 1) * 0x7f800000 | (uint)!(bool)(bVar73 & 1) * (int)fVar226;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar218;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar221;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar222;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar223;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar224;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar75 * 0x7f800000 | (uint)!bVar75 * (int)fVar225;
      auVar124._28_4_ =
           (uint)(bVar73 >> 7) * 0x7f800000 | (uint)!(bool)(bVar73 >> 7) * auVar96._28_4_;
      auVar235 = ZEXT3264(auVar124);
      local_300 = vminps_avx(auVar89,auVar124);
      auVar232 = ZEXT3264(local_300);
      uVar11 = vcmpps_avx512vl(_local_540,local_300,2);
      bVar67 = bVar67 & 0x7f & (byte)uVar11;
      if (bVar67 == 0) {
        auVar253 = ZEXT3264(local_820);
        auVar257 = ZEXT3264(local_840);
        auVar246 = ZEXT3264(local_860);
        auVar247 = ZEXT3264(local_700);
        auVar248 = ZEXT3264(local_720);
        auVar249 = ZEXT3264(local_880);
        auVar251 = ZEXT3264(local_740);
        auVar250 = ZEXT3264(local_8a0);
        auVar252 = ZEXT3264(local_8c0);
        auVar254 = ZEXT3264(local_760);
        auVar256 = ZEXT3264(local_780);
        auVar258 = ZEXT3264(local_7a0);
      }
      else {
        auVar99 = vmaxps_avx512vl(auVar90,auVar98);
        auVar93 = vminps_avx(local_3a0,auVar154);
        auVar57 = ZEXT412(0);
        auVar98 = ZEXT1232(auVar57) << 0x20;
        auVar93 = vmaxps_avx(auVar93,ZEXT1232(auVar57) << 0x20);
        auVar96 = vminps_avx(local_3c0,auVar154);
        auVar245 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar52._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar93._28_4_ + 7.0;
        auVar81 = vfmadd213ps_fma(auVar52,auVar152,local_800);
        local_3a0 = ZEXT1632(auVar81);
        auVar93 = vmaxps_avx(auVar96,ZEXT1232(auVar57) << 0x20);
        auVar53._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar93._28_4_ + 7.0;
        auVar81 = vfmadd213ps_fma(auVar53,auVar152,local_800);
        local_3c0 = ZEXT1632(auVar81);
        auVar207._0_4_ = auVar99._0_4_ * auVar99._0_4_;
        auVar207._4_4_ = auVar99._4_4_ * auVar99._4_4_;
        auVar207._8_4_ = auVar99._8_4_ * auVar99._8_4_;
        auVar207._12_4_ = auVar99._12_4_ * auVar99._12_4_;
        auVar207._16_4_ = auVar99._16_4_ * auVar99._16_4_;
        auVar207._20_4_ = auVar99._20_4_ * auVar99._20_4_;
        auVar207._24_4_ = auVar99._24_4_ * auVar99._24_4_;
        auVar207._28_4_ = 0;
        auVar93 = vsubps_avx512vl(auVar106,auVar207);
        auVar240 = ZEXT3264(auVar93);
        auVar96 = vmulps_avx512vl(auVar111,auVar93);
        auVar96 = vsubps_avx512vl(auVar110,auVar96);
        uVar11 = vcmpps_avx512vl(auVar96,ZEXT1232(auVar57) << 0x20,5);
        bVar73 = (byte)uVar11;
        auVar251 = ZEXT3264(local_740);
        auVar254 = ZEXT3264(local_760);
        auVar256 = ZEXT3264(local_780);
        auVar258 = ZEXT3264(local_7a0);
        if (bVar73 == 0) {
          auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar97 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar96 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar235 = ZEXT864(0) << 0x20;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar126._8_4_ = 0xff800000;
          auVar126._0_8_ = 0xff800000ff800000;
          auVar126._12_4_ = 0xff800000;
          auVar126._16_4_ = 0xff800000;
          auVar126._20_4_ = 0xff800000;
          auVar126._24_4_ = 0xff800000;
          auVar126._28_4_ = 0xff800000;
        }
        else {
          auVar82 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
          uVar77 = vcmpps_avx512vl(auVar96,auVar90,5);
          auVar96 = vsqrtps_avx(auVar96);
          auVar216._0_4_ = auVar94._0_4_ + auVar94._0_4_;
          auVar216._4_4_ = auVar94._4_4_ + auVar94._4_4_;
          auVar216._8_4_ = auVar94._8_4_ + auVar94._8_4_;
          auVar216._12_4_ = auVar94._12_4_ + auVar94._12_4_;
          auVar216._16_4_ = auVar94._16_4_ + auVar94._16_4_;
          auVar216._20_4_ = auVar94._20_4_ + auVar94._20_4_;
          auVar216._24_4_ = auVar94._24_4_ + auVar94._24_4_;
          auVar216._28_4_ = auVar94._28_4_ + auVar94._28_4_;
          auVar98 = vrcp14ps_avx512vl(auVar216);
          auVar81 = vfnmadd213ps_fma(auVar216,auVar98,auVar154);
          auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar98,auVar98);
          auVar25._8_4_ = 0x80000000;
          auVar25._0_8_ = 0x8000000080000000;
          auVar25._12_4_ = 0x80000000;
          auVar25._16_4_ = 0x80000000;
          auVar25._20_4_ = 0x80000000;
          auVar25._24_4_ = 0x80000000;
          auVar25._28_4_ = 0x80000000;
          auVar98 = vxorps_avx512vl(auVar105,auVar25);
          auVar98 = vsubps_avx(auVar98,auVar96);
          auVar54._4_4_ = auVar98._4_4_ * auVar81._4_4_;
          auVar54._0_4_ = auVar98._0_4_ * auVar81._0_4_;
          auVar54._8_4_ = auVar98._8_4_ * auVar81._8_4_;
          auVar54._12_4_ = auVar98._12_4_ * auVar81._12_4_;
          auVar54._16_4_ = auVar98._16_4_ * 0.0;
          auVar54._20_4_ = auVar98._20_4_ * 0.0;
          auVar54._24_4_ = auVar98._24_4_ * 0.0;
          auVar54._28_4_ = 0x3e000000;
          auVar245 = ZEXT3264(auVar54);
          auVar96 = vsubps_avx512vl(auVar96,auVar105);
          auVar55._4_4_ = auVar96._4_4_ * auVar81._4_4_;
          auVar55._0_4_ = auVar96._0_4_ * auVar81._0_4_;
          auVar55._8_4_ = auVar96._8_4_ * auVar81._8_4_;
          auVar55._12_4_ = auVar96._12_4_ * auVar81._12_4_;
          auVar55._16_4_ = auVar96._16_4_ * 0.0;
          auVar55._20_4_ = auVar96._20_4_ * 0.0;
          auVar55._24_4_ = auVar96._24_4_ * 0.0;
          auVar55._28_4_ = 0x7f800000;
          auVar96 = vfmadd213ps_avx512vl(auVar107,auVar54,auVar108);
          auVar56._4_4_ = auVar92._4_4_ * auVar96._4_4_;
          auVar56._0_4_ = auVar92._0_4_ * auVar96._0_4_;
          auVar56._8_4_ = auVar92._8_4_ * auVar96._8_4_;
          auVar56._12_4_ = auVar92._12_4_ * auVar96._12_4_;
          auVar56._16_4_ = auVar92._16_4_ * auVar96._16_4_;
          auVar56._20_4_ = auVar92._20_4_ * auVar96._20_4_;
          auVar56._24_4_ = auVar92._24_4_ * auVar96._24_4_;
          auVar56._28_4_ = auVar98._28_4_;
          auVar96 = vmulps_avx512vl(local_820,auVar54);
          auVar98 = vmulps_avx512vl(local_840,auVar54);
          auVar100 = vmulps_avx512vl(local_340,auVar54);
          auVar99 = vfmadd213ps_avx512vl(auVar103,auVar56,local_520);
          auVar96 = vsubps_avx512vl(auVar96,auVar99);
          auVar99 = vfmadd213ps_avx512vl(auVar95,auVar56,local_7c0);
          auVar99 = vsubps_avx512vl(auVar98,auVar99);
          auVar81 = vfmadd213ps_fma(auVar56,local_7e0,auVar97);
          auVar98 = vsubps_avx(auVar100,ZEXT1632(auVar81));
          auVar235 = ZEXT3264(auVar98);
          auVar98 = vfmadd213ps_avx512vl(auVar107,auVar55,auVar108);
          auVar100 = vmulps_avx512vl(auVar92,auVar98);
          auVar98 = vmulps_avx512vl(local_820,auVar55);
          auVar101 = vmulps_avx512vl(local_840,auVar55);
          auVar102 = vmulps_avx512vl(local_340,auVar55);
          auVar81 = vfmadd213ps_fma(auVar103,auVar100,local_520);
          auVar98 = vsubps_avx(auVar98,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar95,auVar100,local_7c0);
          auVar95 = vsubps_avx512vl(auVar101,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(local_7e0,auVar100,auVar97);
          auVar97 = vsubps_avx512vl(auVar102,ZEXT1632(auVar81));
          auVar155._8_4_ = 0x7f800000;
          auVar155._0_8_ = 0x7f8000007f800000;
          auVar155._12_4_ = 0x7f800000;
          auVar155._16_4_ = 0x7f800000;
          auVar155._20_4_ = 0x7f800000;
          auVar155._24_4_ = 0x7f800000;
          auVar155._28_4_ = 0x7f800000;
          auVar100 = vblendmps_avx512vl(auVar155,auVar54);
          bVar75 = (bool)((byte)uVar77 & 1);
          auVar125._0_4_ = (uint)bVar75 * auVar100._0_4_ | (uint)!bVar75 * local_520._0_4_;
          bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar75 * auVar100._4_4_ | (uint)!bVar75 * local_520._4_4_;
          bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar75 * auVar100._8_4_ | (uint)!bVar75 * local_520._8_4_;
          bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar75 * auVar100._12_4_ | (uint)!bVar75 * local_520._12_4_;
          bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar75 * auVar100._16_4_ | (uint)!bVar75 * local_520._16_4_;
          bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar75 * auVar100._20_4_ | (uint)!bVar75 * local_520._20_4_;
          bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar75 * auVar100._24_4_ | (uint)!bVar75 * local_520._24_4_;
          bVar75 = SUB81(uVar77 >> 7,0);
          auVar125._28_4_ = (uint)bVar75 * auVar100._28_4_ | (uint)!bVar75 * local_520._28_4_;
          auVar156._8_4_ = 0xff800000;
          auVar156._0_8_ = 0xff800000ff800000;
          auVar156._12_4_ = 0xff800000;
          auVar156._16_4_ = 0xff800000;
          auVar156._20_4_ = 0xff800000;
          auVar156._24_4_ = 0xff800000;
          auVar156._28_4_ = 0xff800000;
          auVar100 = vblendmps_avx512vl(auVar156,auVar55);
          bVar75 = (bool)((byte)uVar77 & 1);
          auVar126._0_4_ = (uint)bVar75 * auVar100._0_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar75 * auVar100._4_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar75 * auVar100._8_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar75 * auVar100._12_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar75 * auVar100._16_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar75 * auVar100._20_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar75 * auVar100._24_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = SUB81(uVar77 >> 7,0);
          auVar126._28_4_ = (uint)bVar75 * auVar100._28_4_ | (uint)!bVar75 * -0x800000;
          vandps_avx512vl(auVar109,auVar104);
          auVar100 = vmaxps_avx(local_360,auVar126);
          auVar26._8_4_ = 0x36000000;
          auVar26._0_8_ = 0x3600000036000000;
          auVar26._12_4_ = 0x36000000;
          auVar26._16_4_ = 0x36000000;
          auVar26._20_4_ = 0x36000000;
          auVar26._24_4_ = 0x36000000;
          auVar26._28_4_ = 0x36000000;
          auVar100 = vmulps_avx512vl(auVar100,auVar26);
          vandps_avx512vl(auVar94,auVar104);
          uVar71 = vcmpps_avx512vl(auVar100,auVar100,1);
          uVar77 = uVar77 & uVar71;
          bVar69 = (byte)uVar77;
          if (bVar69 != 0) {
            uVar71 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar82),2);
            auVar228._8_4_ = 0xff800000;
            auVar228._0_8_ = 0xff800000ff800000;
            auVar228._12_4_ = 0xff800000;
            auVar228._16_4_ = 0xff800000;
            auVar228._20_4_ = 0xff800000;
            auVar228._24_4_ = 0xff800000;
            auVar228._28_4_ = 0xff800000;
            auVar239._8_4_ = 0x7f800000;
            auVar239._0_8_ = 0x7f8000007f800000;
            auVar239._12_4_ = 0x7f800000;
            auVar239._16_4_ = 0x7f800000;
            auVar239._20_4_ = 0x7f800000;
            auVar239._24_4_ = 0x7f800000;
            auVar239._28_4_ = 0x7f800000;
            auVar240 = ZEXT3264(auVar239);
            auVar94 = vblendmps_avx512vl(auVar239,auVar228);
            bVar68 = (byte)uVar71;
            uVar78 = (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar100._0_4_
            ;
            bVar75 = (bool)((byte)(uVar71 >> 1) & 1);
            uVar134 = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * auVar100._4_4_;
            bVar75 = (bool)((byte)(uVar71 >> 2) & 1);
            uVar135 = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * auVar100._8_4_;
            bVar75 = (bool)((byte)(uVar71 >> 3) & 1);
            uVar136 = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * auVar100._12_4_;
            bVar75 = (bool)((byte)(uVar71 >> 4) & 1);
            uVar137 = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * auVar100._16_4_;
            bVar75 = (bool)((byte)(uVar71 >> 5) & 1);
            uVar138 = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * auVar100._20_4_;
            bVar75 = (bool)((byte)(uVar71 >> 6) & 1);
            uVar139 = (uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * auVar100._24_4_;
            bVar75 = SUB81(uVar71 >> 7,0);
            uVar140 = (uint)bVar75 * auVar94._28_4_ | (uint)!bVar75 * auVar100._28_4_;
            auVar125._0_4_ = (bVar69 & 1) * uVar78 | !(bool)(bVar69 & 1) * auVar125._0_4_;
            bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar125._4_4_ = bVar75 * uVar134 | !bVar75 * auVar125._4_4_;
            bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar125._8_4_ = bVar75 * uVar135 | !bVar75 * auVar125._8_4_;
            bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar125._12_4_ = bVar75 * uVar136 | !bVar75 * auVar125._12_4_;
            bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar125._16_4_ = bVar75 * uVar137 | !bVar75 * auVar125._16_4_;
            bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar125._20_4_ = bVar75 * uVar138 | !bVar75 * auVar125._20_4_;
            bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar125._24_4_ = bVar75 * uVar139 | !bVar75 * auVar125._24_4_;
            bVar75 = SUB81(uVar77 >> 7,0);
            auVar125._28_4_ = bVar75 * uVar140 | !bVar75 * auVar125._28_4_;
            auVar94 = vblendmps_avx512vl(auVar228,auVar239);
            bVar75 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar71 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar71 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar71 >> 6) & 1);
            bVar10 = SUB81(uVar71 >> 7,0);
            auVar126._0_4_ =
                 (uint)(bVar69 & 1) *
                 ((uint)(bVar68 & 1) * auVar94._0_4_ | !(bool)(bVar68 & 1) * uVar78) |
                 !(bool)(bVar69 & 1) * auVar126._0_4_;
            bVar4 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar126._4_4_ =
                 (uint)bVar4 * ((uint)bVar75 * auVar94._4_4_ | !bVar75 * uVar134) |
                 !bVar4 * auVar126._4_4_;
            bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar126._8_4_ =
                 (uint)bVar75 * ((uint)bVar5 * auVar94._8_4_ | !bVar5 * uVar135) |
                 !bVar75 * auVar126._8_4_;
            bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar126._12_4_ =
                 (uint)bVar75 * ((uint)bVar6 * auVar94._12_4_ | !bVar6 * uVar136) |
                 !bVar75 * auVar126._12_4_;
            bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar126._16_4_ =
                 (uint)bVar75 * ((uint)bVar7 * auVar94._16_4_ | !bVar7 * uVar137) |
                 !bVar75 * auVar126._16_4_;
            bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar126._20_4_ =
                 (uint)bVar75 * ((uint)bVar8 * auVar94._20_4_ | !bVar8 * uVar138) |
                 !bVar75 * auVar126._20_4_;
            bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar126._24_4_ =
                 (uint)bVar75 * ((uint)bVar9 * auVar94._24_4_ | !bVar9 * uVar139) |
                 !bVar75 * auVar126._24_4_;
            bVar75 = SUB81(uVar77 >> 7,0);
            auVar126._28_4_ =
                 (uint)bVar75 * ((uint)bVar10 * auVar94._28_4_ | !bVar10 * uVar140) |
                 !bVar75 * auVar126._28_4_;
            bVar73 = (~bVar69 | bVar68) & bVar73;
          }
        }
        auVar257 = ZEXT3264(local_840);
        auVar253 = ZEXT3264(local_820);
        auVar246 = ZEXT3264(local_860);
        auVar249 = ZEXT3264(local_880);
        auVar250 = ZEXT3264(local_8a0);
        auVar252 = ZEXT3264(local_8c0);
        auVar94 = vmulps_avx512vl(local_340,auVar97);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_840,auVar95);
        auVar94 = vfmadd231ps_avx512vl(auVar94,local_820,auVar98);
        _local_1c0 = _local_540;
        local_1a0 = vminps_avx(local_300,auVar125);
        vandps_avx512vl(auVar94,auVar104);
        _local_320 = vmaxps_avx(_local_540,auVar126);
        auVar157._8_4_ = 0x3e99999a;
        auVar157._0_8_ = 0x3e99999a3e99999a;
        auVar157._12_4_ = 0x3e99999a;
        auVar157._16_4_ = 0x3e99999a;
        auVar157._20_4_ = 0x3e99999a;
        auVar157._24_4_ = 0x3e99999a;
        auVar157._28_4_ = 0x3e99999a;
        uVar11 = vcmpps_avx512vl(auVar94,auVar157,1);
        local_8cc = (undefined4)uVar11;
        uVar11 = vcmpps_avx512vl(_local_540,local_1a0,2);
        bVar69 = (byte)uVar11 & bVar67;
        _local_400 = _local_320;
        uVar12 = vcmpps_avx512vl(_local_320,local_300,2);
        auVar247 = ZEXT3264(local_700);
        auVar248 = ZEXT3264(local_720);
        if ((bVar67 & ((byte)uVar12 | (byte)uVar11)) != 0) {
          auVar94 = vmulps_avx512vl(local_340,auVar235._0_32_);
          auVar94 = vfmadd213ps_avx512vl(auVar99,local_840,auVar94);
          auVar94 = vfmadd213ps_avx512vl(auVar96,local_820,auVar94);
          vandps_avx512vl(auVar94,auVar104);
          uVar11 = vcmpps_avx512vl(auVar94,auVar157,1);
          local_8d4 = (uint)(byte)~bVar73;
          bVar73 = (byte)uVar11 | ~bVar73;
          auVar158._8_4_ = 2;
          auVar158._0_8_ = 0x200000002;
          auVar158._12_4_ = 2;
          auVar158._16_4_ = 2;
          auVar158._20_4_ = 2;
          auVar158._24_4_ = 2;
          auVar158._28_4_ = 2;
          auVar27._8_4_ = 3;
          auVar27._0_8_ = 0x300000003;
          auVar27._12_4_ = 3;
          auVar27._16_4_ = 3;
          auVar27._20_4_ = 3;
          auVar27._24_4_ = 3;
          auVar27._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar158,auVar27);
          local_2e0._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar75 = (bool)(bVar73 >> 1 & 1);
          local_2e0._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 2 & 1);
          local_2e0._8_4_ = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 3 & 1);
          local_2e0._12_4_ = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 4 & 1);
          local_2e0._16_4_ = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 5 & 1);
          local_2e0._20_4_ = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 6 & 1);
          local_2e0._24_4_ = (uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * 2;
          local_2e0._28_4_ = (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar11 = vpcmpd_avx512vl(local_380,local_2e0,5);
          local_8d0 = (uint)bVar69;
          bVar69 = (byte)uVar11 & bVar69;
          if (bVar69 == 0) {
            auVar211._8_4_ = 0x7fffffff;
            auVar211._0_8_ = 0x7fffffff7fffffff;
            auVar211._12_4_ = 0x7fffffff;
          }
          else {
            auVar82 = vminps_avx(local_620._0_16_,local_660._0_16_);
            auVar81 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
            auVar79 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar83 = vminps_avx(auVar82,auVar79);
            auVar82 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar79 = vmaxps_avx(auVar81,auVar82);
            auVar183._8_4_ = 0x7fffffff;
            auVar183._0_8_ = 0x7fffffff7fffffff;
            auVar183._12_4_ = 0x7fffffff;
            auVar81 = vandps_avx(auVar83,auVar183);
            auVar82 = vandps_avx(auVar79,auVar183);
            auVar81 = vmaxps_avx(auVar81,auVar82);
            auVar82 = vmovshdup_avx(auVar81);
            auVar82 = vmaxss_avx(auVar82,auVar81);
            auVar81 = vshufpd_avx(auVar81,auVar81,1);
            auVar81 = vmaxss_avx(auVar81,auVar82);
            fVar226 = auVar81._0_4_ * 1.9073486e-06;
            local_5e0 = vshufps_avx(auVar79,auVar79,0xff);
            local_3e0 = (float)local_540._0_4_ + (float)local_420._0_4_;
            fStack_3dc = (float)local_540._4_4_ + (float)local_420._4_4_;
            fStack_3d8 = fStack_538 + fStack_418;
            fStack_3d4 = fStack_534 + fStack_414;
            fStack_3d0 = fStack_530 + fStack_410;
            fStack_3cc = fStack_52c + fStack_40c;
            fStack_3c8 = fStack_528 + fStack_408;
            fStack_3c4 = fStack_524 + fStack_404;
            do {
              auVar95 = local_800;
              auVar159._8_4_ = 0x7f800000;
              auVar159._0_8_ = 0x7f8000007f800000;
              auVar159._12_4_ = 0x7f800000;
              auVar159._16_4_ = 0x7f800000;
              auVar159._20_4_ = 0x7f800000;
              auVar159._24_4_ = 0x7f800000;
              auVar159._28_4_ = 0x7f800000;
              auVar94 = vblendmps_avx512vl(auVar159,_local_540);
              auVar127._0_4_ =
                   (uint)(bVar69 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar69 & 1) * 0x7f800000;
              bVar75 = (bool)(bVar69 >> 1 & 1);
              auVar127._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar69 >> 2 & 1);
              auVar127._8_4_ = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar69 >> 3 & 1);
              auVar127._12_4_ = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar69 >> 4 & 1);
              auVar127._16_4_ = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar69 >> 5 & 1);
              auVar127._20_4_ = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar69 >> 6 & 1);
              auVar127._24_4_ = (uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * 0x7f800000;
              auVar127._28_4_ =
                   (uint)(bVar69 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar69 >> 7) * 0x7f800000;
              auVar94 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar94 = vminps_avx(auVar127,auVar94);
              auVar93 = vshufpd_avx(auVar94,auVar94,5);
              auVar94 = vminps_avx(auVar94,auVar93);
              auVar93 = vpermpd_avx2(auVar94,0x4e);
              auVar94 = vminps_avx(auVar94,auVar93);
              uVar11 = vcmpps_avx512vl(auVar127,auVar94,0);
              bVar68 = (byte)uVar11 & bVar69;
              bVar73 = bVar69;
              if (bVar68 != 0) {
                bVar73 = bVar68;
              }
              iVar14 = 0;
              for (uVar78 = (uint)bVar73; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              bVar73 = '\x01' << ((byte)iVar14 & 0x1f);
              uVar78 = *(uint *)(local_3a0 + (uint)(iVar14 << 2));
              uVar134 = *(uint *)(local_1c0 + (uint)(iVar14 << 2));
              fVar218 = local_8c8;
              if ((float)local_6a0._0_4_ < 0.0) {
                local_800[1] = 0;
                local_800[0] = bVar69;
                local_800._2_30_ = auVar95._2_30_;
                fVar218 = sqrtf((float)local_6a0._0_4_);
                bVar69 = local_800[0];
              }
              auVar235 = ZEXT464(uVar78);
              auVar232 = ZEXT464(uVar134);
              bVar68 = ~bVar73;
              lVar74 = 5;
              do {
                fVar221 = auVar232._0_4_;
                auVar144._4_4_ = fVar221;
                auVar144._0_4_ = fVar221;
                auVar144._8_4_ = fVar221;
                auVar144._12_4_ = fVar221;
                auVar81 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_690);
                fVar229 = auVar235._0_4_;
                fVar198 = 1.0 - fVar229;
                auVar80 = SUB6416(ZEXT464(0x40400000),0);
                auVar84 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar234 = auVar235._0_16_;
                auVar79 = vfmadd213ss_fma(auVar80,auVar234,auVar84);
                auVar82 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar229 * fVar229)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar83 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar198),auVar84);
                auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar198 * fVar198)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar222 = fVar198 * fVar198 * -fVar229 * 0.5;
                fVar223 = auVar82._0_4_ * 0.5;
                fVar224 = auVar83._0_4_ * 0.5;
                fVar225 = fVar229 * fVar229 * -fVar198 * 0.5;
                auVar199._0_4_ = fVar225 * (float)local_680._0_4_;
                auVar199._4_4_ = fVar225 * (float)local_680._4_4_;
                auVar199._8_4_ = fVar225 * fStack_678;
                auVar199._12_4_ = fVar225 * fStack_674;
                auVar210._4_4_ = fVar224;
                auVar210._0_4_ = fVar224;
                auVar210._8_4_ = fVar224;
                auVar210._12_4_ = fVar224;
                auVar82 = vfmadd132ps_fma(auVar210,auVar199,local_640._0_16_);
                auVar184._4_4_ = fVar223;
                auVar184._0_4_ = fVar223;
                auVar184._8_4_ = fVar223;
                auVar184._12_4_ = fVar223;
                auVar82 = vfmadd132ps_fma(auVar184,auVar82,local_660._0_16_);
                auVar200._4_4_ = fVar222;
                auVar200._0_4_ = fVar222;
                auVar200._8_4_ = fVar222;
                auVar200._12_4_ = fVar222;
                auVar82 = vfmadd132ps_fma(auVar200,auVar82,local_620._0_16_);
                local_570 = vfmadd231ss_fma(auVar84,auVar234,ZEXT416(0x41100000));
                local_580 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar234,
                                            ZEXT416(0x40800000));
                local_590 = vfmadd213ss_fma(auVar80,auVar234,ZEXT416(0xbf800000));
                local_520._0_16_ = auVar82;
                auVar81 = vsubps_avx(auVar81,auVar82);
                local_800._0_16_ = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                fVar222 = auVar81._0_4_;
                if (fVar222 < 0.0) {
                  local_7c0._0_4_ = auVar79._0_4_;
                  local_7e0._0_16_ = ZEXT416((uint)fVar198);
                  auVar209._0_4_ = sqrtf(fVar222);
                  auVar209._4_60_ = extraout_var;
                  auVar79 = ZEXT416((uint)local_7c0._0_4_);
                  auVar82 = auVar209._0_16_;
                  auVar83 = local_7e0._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar81,auVar81);
                  auVar83 = ZEXT416((uint)fVar198);
                }
                fVar223 = auVar83._0_4_;
                auVar80 = vfnmadd231ss_fma(ZEXT416((uint)(fVar229 * (fVar223 + fVar223))),auVar83,
                                           auVar83);
                auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar229 + fVar229)),
                                          ZEXT416((uint)(fVar229 * fVar229 * 3.0)));
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar234,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223 * -3.0)),
                                          ZEXT416((uint)(fVar223 + fVar223)),auVar83);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar198 * -2.0)),auVar234,
                                          ZEXT416((uint)(fVar229 * fVar229)));
                fVar223 = auVar80._0_4_ * 0.5;
                fVar224 = auVar79._0_4_ * 0.5;
                fVar225 = auVar84._0_4_ * 0.5;
                fVar198 = auVar83._0_4_ * 0.5;
                auVar201._0_4_ = fVar198 * (float)local_680._0_4_;
                auVar201._4_4_ = fVar198 * (float)local_680._4_4_;
                auVar201._8_4_ = fVar198 * fStack_678;
                auVar201._12_4_ = fVar198 * fStack_674;
                auVar185._4_4_ = fVar225;
                auVar185._0_4_ = fVar225;
                auVar185._8_4_ = fVar225;
                auVar185._12_4_ = fVar225;
                auVar79 = vfmadd132ps_fma(auVar185,auVar201,local_640._0_16_);
                auVar164._4_4_ = fVar224;
                auVar164._0_4_ = fVar224;
                auVar164._8_4_ = fVar224;
                auVar164._12_4_ = fVar224;
                auVar79 = vfmadd132ps_fma(auVar164,auVar79,local_660._0_16_);
                auVar243._4_4_ = fVar223;
                auVar243._0_4_ = fVar223;
                auVar243._8_4_ = fVar223;
                auVar243._12_4_ = fVar223;
                local_7c0._0_16_ = vfmadd132ps_fma(auVar243,auVar79,local_620._0_16_);
                auVar79 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT812(0);
                fVar223 = auVar79._0_4_;
                auVar83 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar223));
                fVar224 = auVar83._0_4_;
                auVar84 = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar223));
                auVar15._8_4_ = 0x80000000;
                auVar15._0_8_ = 0x8000000080000000;
                auVar15._12_4_ = 0x80000000;
                auVar80 = vxorps_avx512vl(auVar79,auVar15);
                auVar83 = vfnmadd213ss_fma(auVar84,auVar79,SUB6416(ZEXT464(0x40000000),0));
                local_7e0._0_4_ = auVar82._0_4_;
                if (fVar223 < auVar80._0_4_) {
                  fVar225 = sqrtf(fVar223);
                  auVar82 = ZEXT416((uint)local_7e0._0_4_);
                  auVar79 = local_7c0._0_16_;
                }
                else {
                  auVar79 = vsqrtss_avx(auVar79,auVar79);
                  fVar225 = auVar79._0_4_;
                  auVar79 = local_7c0._0_16_;
                }
                fVar224 = fVar224 * 1.5 + fVar223 * -0.5 * fVar224 * fVar224 * fVar224;
                auVar145._0_4_ = auVar79._0_4_ * fVar224;
                auVar145._4_4_ = auVar79._4_4_ * fVar224;
                auVar145._8_4_ = auVar79._8_4_ * fVar224;
                auVar145._12_4_ = auVar79._12_4_ * fVar224;
                auVar80 = vdpps_avx(local_800._0_16_,auVar145,0x7f);
                fVar227 = auVar82._0_4_;
                auVar146._0_4_ = auVar80._0_4_ * auVar80._0_4_;
                auVar146._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar146._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar146._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar85 = vsubps_avx512vl(auVar81,auVar146);
                fVar198 = auVar85._0_4_;
                auVar165._4_12_ = ZEXT812(0) << 0x20;
                auVar165._0_4_ = fVar198;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
                auVar87 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                if (fVar198 < 0.0) {
                  local_5c0 = fVar224;
                  fStack_5bc = fVar224;
                  fStack_5b8 = fVar224;
                  fStack_5b4 = fVar224;
                  local_5b0 = auVar86;
                  local_5a0 = auVar80;
                  fVar143 = sqrtf(fVar198);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar82 = ZEXT416((uint)local_7e0._0_4_);
                  auVar79 = local_7c0._0_16_;
                  auVar80 = local_5a0;
                  auVar86 = local_5b0;
                  fVar224 = local_5c0;
                  fVar230 = fStack_5bc;
                  fVar231 = fStack_5b8;
                  fVar233 = fStack_5b4;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar143 = auVar85._0_4_;
                  fVar230 = fVar224;
                  fVar231 = fVar224;
                  fVar233 = fVar224;
                }
                auVar245 = ZEXT1664(auVar79);
                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar255 = ZEXT3264(auVar94);
                auVar253 = ZEXT3264(local_820);
                auVar257 = ZEXT3264(local_840);
                auVar246 = ZEXT3264(local_860);
                auVar247 = ZEXT3264(local_700);
                auVar248 = ZEXT3264(local_720);
                auVar249 = ZEXT3264(local_880);
                auVar251 = ZEXT3264(local_740);
                auVar250 = ZEXT3264(local_8a0);
                auVar252 = ZEXT3264(local_8c0);
                auVar254 = ZEXT3264(local_760);
                auVar256 = ZEXT3264(local_780);
                auVar258 = ZEXT3264(local_7a0);
                auVar166._0_4_ = (float)local_590._0_4_ * (float)local_680._0_4_;
                auVar166._4_4_ = (float)local_590._0_4_ * (float)local_680._4_4_;
                auVar166._8_4_ = (float)local_590._0_4_ * fStack_678;
                auVar166._12_4_ = (float)local_590._0_4_ * fStack_674;
                auVar186._4_4_ = local_580._0_4_;
                auVar186._0_4_ = local_580._0_4_;
                auVar186._8_4_ = local_580._0_4_;
                auVar186._12_4_ = local_580._0_4_;
                auVar85 = vfmadd132ps_fma(auVar186,auVar166,local_640._0_16_);
                auVar167._4_4_ = local_570._0_4_;
                auVar167._0_4_ = local_570._0_4_;
                auVar167._8_4_ = local_570._0_4_;
                auVar167._12_4_ = local_570._0_4_;
                auVar85 = vfmadd132ps_fma(auVar167,auVar85,local_660._0_16_);
                auVar234 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar234,
                                           ZEXT416(0x40000000));
                auVar187._0_4_ = auVar234._0_4_;
                auVar187._4_4_ = auVar187._0_4_;
                auVar187._8_4_ = auVar187._0_4_;
                auVar187._12_4_ = auVar187._0_4_;
                auVar234 = vfmadd132ps_fma(auVar187,auVar85,local_620._0_16_);
                auVar168._0_4_ = auVar234._0_4_ * fVar223;
                auVar168._4_4_ = auVar234._4_4_ * fVar223;
                auVar168._8_4_ = auVar234._8_4_ * fVar223;
                auVar168._12_4_ = auVar234._12_4_ * fVar223;
                auVar234 = vdpps_avx(auVar79,auVar234,0x7f);
                fVar223 = auVar234._0_4_;
                auVar188._0_4_ = auVar79._0_4_ * fVar223;
                auVar188._4_4_ = auVar79._4_4_ * fVar223;
                auVar188._8_4_ = auVar79._8_4_ * fVar223;
                auVar188._12_4_ = auVar79._12_4_ * fVar223;
                auVar85 = vsubps_avx(auVar168,auVar188);
                local_920 = auVar84._0_4_;
                local_920 = auVar83._0_4_ * local_920;
                auVar234 = vmaxss_avx(ZEXT416((uint)fVar226),
                                      ZEXT416((uint)(fVar221 * fVar218 * 1.9073486e-06)));
                auVar16._8_4_ = 0x80000000;
                auVar16._0_8_ = 0x8000000080000000;
                auVar16._12_4_ = 0x80000000;
                auVar129._16_16_ = local_7a0._16_16_;
                auVar88 = vxorps_avx512vl(auVar79,auVar16);
                auVar189._0_4_ = fVar224 * auVar85._0_4_ * local_920;
                auVar189._4_4_ = fVar230 * auVar85._4_4_ * local_920;
                auVar189._8_4_ = fVar231 * auVar85._8_4_ * local_920;
                auVar189._12_4_ = fVar233 * auVar85._12_4_ * local_920;
                auVar240 = ZEXT1664(auVar145);
                auVar83 = vdpps_avx(auVar88,auVar145,0x7f);
                auVar84 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar226),auVar234);
                auVar82 = vdpps_avx(local_800._0_16_,auVar189,0x7f);
                auVar85 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                          ZEXT416((uint)(fVar226 / fVar225)),auVar84);
                fVar223 = auVar83._0_4_ + auVar82._0_4_;
                auVar82 = vdpps_avx(local_690,auVar145,0x7f);
                auVar83 = vdpps_avx(local_800._0_16_,auVar88,0x7f);
                fVar224 = auVar86._0_4_;
                auVar88 = vaddss_avx512f(auVar87,ZEXT416((uint)(fVar224 * fVar198 * -0.5 *
                                                               fVar224 * fVar224)));
                auVar84 = vdpps_avx(local_800._0_16_,local_690,0x7f);
                auVar86 = vfnmadd231ss_fma(auVar83,auVar80,ZEXT416((uint)fVar223));
                auVar87 = vfnmadd231ss_fma(auVar84,auVar80,auVar82);
                auVar83 = vpermilps_avx(local_520._0_16_,0xff);
                fVar143 = fVar143 - auVar83._0_4_;
                auVar83 = vshufps_avx(auVar79,auVar79,0xff);
                auVar84 = vfmsub213ss_fma(auVar86,auVar88,auVar83);
                fVar224 = auVar87._0_4_ * auVar88._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar84._0_4_)),
                                          ZEXT416((uint)fVar223),ZEXT416((uint)fVar224));
                fVar225 = auVar86._0_4_;
                fVar229 = fVar229 - (auVar80._0_4_ * (fVar224 / fVar225) -
                                    fVar143 * (auVar82._0_4_ / fVar225));
                auVar235 = ZEXT464((uint)fVar229);
                fVar221 = fVar221 - (fVar143 * (fVar223 / fVar225) -
                                    auVar80._0_4_ * (auVar84._0_4_ / fVar225));
                auVar232 = ZEXT464((uint)fVar221);
                auVar211._8_4_ = 0x7fffffff;
                auVar211._0_8_ = 0x7fffffff7fffffff;
                auVar211._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx(auVar80,auVar211);
                bVar75 = true;
                if (auVar82._0_4_ < auVar85._0_4_) {
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ + auVar234._0_4_)),
                                            local_5e0,ZEXT416(0x36000000));
                  auVar82 = vandps_avx(ZEXT416((uint)fVar143),auVar211);
                  if (auVar82._0_4_ < auVar84._0_4_) {
                    fVar221 = fVar221 + (float)local_5d0._0_4_;
                    auVar232 = ZEXT464((uint)fVar221);
                    if ((((fVar141 <= fVar221) &&
                         (fVar223 = *(float *)(ray + k * 4 + 0x80), fVar221 <= fVar223)) &&
                        (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                      auVar129._0_16_ = ZEXT816(0) << 0x20;
                      auVar128._4_28_ = auVar129._4_28_;
                      auVar128._0_4_ = fVar222;
                      auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar128._0_16_);
                      fVar222 = auVar82._0_4_;
                      auVar81 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                      pGVar2 = (context->scene->geometries).items[local_8e8].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar73 = true;
                        }
                        else {
                          fVar222 = fVar222 * 1.5 + auVar81._0_4_ * fVar222 * fVar222 * fVar222;
                          auVar169._0_4_ = local_800._0_4_ * fVar222;
                          auVar169._4_4_ = local_800._4_4_ * fVar222;
                          auVar169._8_4_ = local_800._8_4_ * fVar222;
                          auVar169._12_4_ = local_800._12_4_ * fVar222;
                          auVar84 = vfmadd213ps_fma(auVar83,auVar169,auVar79);
                          auVar81 = vshufps_avx(auVar169,auVar169,0xc9);
                          auVar82 = vshufps_avx(auVar79,auVar79,0xc9);
                          auVar170._0_4_ = auVar169._0_4_ * auVar82._0_4_;
                          auVar170._4_4_ = auVar169._4_4_ * auVar82._4_4_;
                          auVar170._8_4_ = auVar169._8_4_ * auVar82._8_4_;
                          auVar170._12_4_ = auVar169._12_4_ * auVar82._12_4_;
                          auVar83 = vfmsub231ps_fma(auVar170,auVar79,auVar81);
                          auVar81 = vshufps_avx(auVar83,auVar83,0xc9);
                          auVar82 = vshufps_avx(auVar84,auVar84,0xc9);
                          auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                          auVar147._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                          auVar147._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                          auVar147._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                          auVar147._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                          auVar81 = vfmsub231ps_fma(auVar147,auVar81,auVar82);
                          local_4c0 = (RTCHitN  [16])vshufps_avx(auVar81,auVar81,0x55);
                          auStack_4b0 = vshufps_avx(auVar81,auVar81,0xaa);
                          local_4a0 = auVar81._0_4_;
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          local_490 = fVar229;
                          fStack_48c = fVar229;
                          fStack_488 = fVar229;
                          fStack_484 = fVar229;
                          local_480 = ZEXT416(0) << 0x20;
                          local_470 = local_4d0._0_8_;
                          uStack_468 = local_4d0._8_8_;
                          local_460 = local_4e0;
                          vpcmpeqd_avx2(ZEXT1632(local_4e0),ZEXT1632(local_4e0));
                          uStack_44c = context->user->instID[0];
                          local_450 = uStack_44c;
                          uStack_448 = uStack_44c;
                          uStack_444 = uStack_44c;
                          uStack_440 = context->user->instPrimID[0];
                          uStack_43c = uStack_440;
                          uStack_438 = uStack_440;
                          uStack_434 = uStack_440;
                          *(float *)(ray + k * 4 + 0x80) = fVar221;
                          local_900 = local_4f0._0_8_;
                          uStack_8f8 = local_4f0._8_8_;
                          local_6d0.valid = (int *)&local_900;
                          local_6d0.geometryUserPtr = pGVar2->userPtr;
                          local_6d0.context = context->user;
                          local_6d0.hit = local_4c0;
                          local_6d0.N = 4;
                          local_6d0.ray = (RTCRayN *)ray;
                          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar240 = ZEXT1664(auVar145);
                            auVar245 = ZEXT1664(auVar79);
                            (*pGVar2->occlusionFilterN)(&local_6d0);
                            auVar232 = ZEXT1664(ZEXT416((uint)fVar221));
                            auVar235 = ZEXT1664(ZEXT416((uint)fVar229));
                            auVar258 = ZEXT3264(local_7a0);
                            auVar256 = ZEXT3264(local_780);
                            auVar254 = ZEXT3264(local_760);
                            auVar252 = ZEXT3264(local_8c0);
                            auVar250 = ZEXT3264(local_8a0);
                            auVar251 = ZEXT3264(local_740);
                            auVar249 = ZEXT3264(local_880);
                            auVar248 = ZEXT3264(local_720);
                            auVar247 = ZEXT3264(local_700);
                            auVar246 = ZEXT3264(local_860);
                            auVar257 = ZEXT3264(local_840);
                            auVar253 = ZEXT3264(local_820);
                            auVar211._8_4_ = 0x7fffffff;
                            auVar211._0_8_ = 0x7fffffff7fffffff;
                            auVar211._12_4_ = 0x7fffffff;
                            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar255 = ZEXT3264(auVar94);
                          }
                          auVar60._8_8_ = uStack_8f8;
                          auVar60._0_8_ = local_900;
                          uVar77 = vptestmd_avx512vl(auVar60,auVar60);
                          if ((uVar77 & 0xf) == 0) {
                            bVar73 = false;
                          }
                          else {
                            p_Var3 = context->args->filter;
                            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              (*p_Var3)(&local_6d0);
                              auVar232 = ZEXT1664(ZEXT416((uint)fVar221));
                              auVar235 = ZEXT1664(ZEXT416((uint)fVar229));
                              auVar258 = ZEXT3264(local_7a0);
                              auVar256 = ZEXT3264(local_780);
                              auVar254 = ZEXT3264(local_760);
                              auVar252 = ZEXT3264(local_8c0);
                              auVar250 = ZEXT3264(local_8a0);
                              auVar251 = ZEXT3264(local_740);
                              auVar249 = ZEXT3264(local_880);
                              auVar248 = ZEXT3264(local_720);
                              auVar247 = ZEXT3264(local_700);
                              auVar246 = ZEXT3264(local_860);
                              auVar257 = ZEXT3264(local_840);
                              auVar253 = ZEXT3264(local_820);
                              auVar211._8_4_ = 0x7fffffff;
                              auVar211._0_8_ = 0x7fffffff7fffffff;
                              auVar211._12_4_ = 0x7fffffff;
                              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar255 = ZEXT3264(auVar94);
                            }
                            auVar61._8_8_ = uStack_8f8;
                            auVar61._0_8_ = local_900;
                            uVar77 = vptestmd_avx512vl(auVar61,auVar61);
                            uVar77 = uVar77 & 0xf;
                            auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar75 = (bool)((byte)uVar77 & 1);
                            bVar4 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar5 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar6 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_6d0.ray + 0x80) =
                                 (uint)bVar75 * auVar81._0_4_ |
                                 (uint)!bVar75 * *(int *)(local_6d0.ray + 0x80);
                            *(uint *)(local_6d0.ray + 0x84) =
                                 (uint)bVar4 * auVar81._4_4_ |
                                 (uint)!bVar4 * *(int *)(local_6d0.ray + 0x84);
                            *(uint *)(local_6d0.ray + 0x88) =
                                 (uint)bVar5 * auVar81._8_4_ |
                                 (uint)!bVar5 * *(int *)(local_6d0.ray + 0x88);
                            *(uint *)(local_6d0.ray + 0x8c) =
                                 (uint)bVar6 * auVar81._12_4_ |
                                 (uint)!bVar6 * *(int *)(local_6d0.ray + 0x8c);
                            bVar73 = (byte)uVar77 != 0;
                          }
                          if ((bool)bVar73 == false) {
                            *(float *)(ray + k * 4 + 0x80) = fVar223;
                          }
                        }
                        bVar75 = false;
                        goto LAB_01dae322;
                      }
                    }
                    bVar75 = false;
                    bVar73 = 0;
                  }
                }
LAB_01dae322:
                if (!bVar75) goto LAB_01dae716;
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              bVar73 = 0;
LAB_01dae716:
              bVar72 = bVar72 | bVar73 & 1;
              auVar64._4_4_ = fStack_3dc;
              auVar64._0_4_ = local_3e0;
              auVar64._8_4_ = fStack_3d8;
              auVar64._12_4_ = fStack_3d4;
              auVar64._16_4_ = fStack_3d0;
              auVar64._20_4_ = fStack_3cc;
              auVar64._24_4_ = fStack_3c8;
              auVar64._28_4_ = fStack_3c4;
              uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar28._4_4_ = uVar142;
              auVar28._0_4_ = uVar142;
              auVar28._8_4_ = uVar142;
              auVar28._12_4_ = uVar142;
              auVar28._16_4_ = uVar142;
              auVar28._20_4_ = uVar142;
              auVar28._24_4_ = uVar142;
              auVar28._28_4_ = uVar142;
              uVar11 = vcmpps_avx512vl(auVar64,auVar28,2);
              bVar69 = bVar68 & bVar69 & (byte)uVar11;
            } while (bVar69 != 0);
          }
          auVar160._0_4_ = (float)local_420._0_4_ + (float)local_400._0_4_;
          auVar160._4_4_ = (float)local_420._4_4_ + (float)local_400._4_4_;
          auVar160._8_4_ = fStack_418 + fStack_3f8;
          auVar160._12_4_ = fStack_414 + fStack_3f4;
          auVar160._16_4_ = fStack_410 + fStack_3f0;
          auVar160._20_4_ = fStack_40c + fStack_3ec;
          auVar160._24_4_ = fStack_408 + fStack_3e8;
          auVar160._28_4_ = fStack_404 + fStack_3e4;
          uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar29._4_4_ = uVar142;
          auVar29._0_4_ = uVar142;
          auVar29._8_4_ = uVar142;
          auVar29._12_4_ = uVar142;
          auVar29._16_4_ = uVar142;
          auVar29._20_4_ = uVar142;
          auVar29._24_4_ = uVar142;
          auVar29._28_4_ = uVar142;
          uVar11 = vcmpps_avx512vl(auVar160,auVar29,2);
          bVar73 = (byte)local_8cc | (byte)local_8d4;
          bVar67 = (byte)uVar12 & bVar67 & (byte)uVar11;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar94 = vpblendmd_avx512vl(auVar161,auVar30);
          local_400._0_4_ = (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar75 = (bool)(bVar73 >> 1 & 1);
          local_400._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 2 & 1);
          fStack_3f8 = (float)((uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 3 & 1);
          fStack_3f4 = (float)((uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 4 & 1);
          fStack_3f0 = (float)((uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 5 & 1);
          fStack_3ec = (float)((uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 6 & 1);
          fStack_3e8 = (float)((uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * 2);
          fStack_3e4 = (float)((uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2
                              );
          uVar11 = vpcmpd_avx512vl(_local_400,local_380,2);
          bVar73 = (byte)uVar11 & bVar67;
          if (bVar73 != 0) {
            auVar82 = vminps_avx(local_620._0_16_,local_660._0_16_);
            auVar81 = vmaxps_avx(local_620._0_16_,local_660._0_16_);
            auVar79 = vminps_avx(local_640._0_16_,local_680._0_16_);
            auVar83 = vminps_avx(auVar82,auVar79);
            auVar82 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
            auVar79 = vmaxps_avx(auVar81,auVar82);
            auVar81 = vandps_avx(auVar83,auVar211);
            auVar82 = vandps_avx(auVar79,auVar211);
            auVar81 = vmaxps_avx(auVar81,auVar82);
            auVar82 = vmovshdup_avx(auVar81);
            auVar82 = vmaxss_avx(auVar82,auVar81);
            auVar81 = vshufpd_avx(auVar81,auVar81,1);
            auVar81 = vmaxss_avx(auVar81,auVar82);
            fVar226 = auVar81._0_4_ * 1.9073486e-06;
            local_5e0 = vshufps_avx(auVar79,auVar79,0xff);
            _local_540 = _local_320;
            local_3e0 = (float)local_420._0_4_ + (float)local_320._0_4_;
            fStack_3dc = (float)local_420._4_4_ + (float)local_320._4_4_;
            fStack_3d8 = fStack_418 + fStack_318;
            fStack_3d4 = fStack_414 + fStack_314;
            fStack_3d0 = fStack_410 + fStack_310;
            fStack_3cc = fStack_40c + fStack_30c;
            fStack_3c8 = fStack_408 + fStack_308;
            fStack_3c4 = fStack_404 + fStack_304;
            do {
              auVar95 = local_800;
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar94 = vblendmps_avx512vl(auVar162,_local_540);
              auVar130._0_4_ =
                   (uint)(bVar73 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 1 & 1);
              auVar130._4_4_ = (uint)bVar75 * auVar94._4_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 2 & 1);
              auVar130._8_4_ = (uint)bVar75 * auVar94._8_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 3 & 1);
              auVar130._12_4_ = (uint)bVar75 * auVar94._12_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 4 & 1);
              auVar130._16_4_ = (uint)bVar75 * auVar94._16_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 5 & 1);
              auVar130._20_4_ = (uint)bVar75 * auVar94._20_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 6 & 1);
              auVar130._24_4_ = (uint)bVar75 * auVar94._24_4_ | (uint)!bVar75 * 0x7f800000;
              auVar130._28_4_ =
                   (uint)(bVar73 >> 7) * auVar94._28_4_ | (uint)!(bool)(bVar73 >> 7) * 0x7f800000;
              auVar94 = vshufps_avx(auVar130,auVar130,0xb1);
              auVar94 = vminps_avx(auVar130,auVar94);
              auVar93 = vshufpd_avx(auVar94,auVar94,5);
              auVar94 = vminps_avx(auVar94,auVar93);
              auVar93 = vpermpd_avx2(auVar94,0x4e);
              auVar94 = vminps_avx(auVar94,auVar93);
              uVar11 = vcmpps_avx512vl(auVar130,auVar94,0);
              bVar68 = (byte)uVar11 & bVar73;
              bVar69 = bVar73;
              if (bVar68 != 0) {
                bVar69 = bVar68;
              }
              iVar14 = 0;
              for (uVar78 = (uint)bVar69; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              bVar69 = '\x01' << ((byte)iVar14 & 0x1f);
              uVar78 = *(uint *)(local_3c0 + (uint)(iVar14 << 2));
              uVar134 = *(uint *)(local_300 + (uint)(iVar14 << 2));
              fVar218 = local_8c4;
              if ((float)local_6a0._0_4_ < 0.0) {
                local_800[1] = 0;
                local_800[0] = bVar73;
                local_800._2_30_ = auVar95._2_30_;
                fVar218 = sqrtf((float)local_6a0._0_4_);
                bVar73 = local_800[0];
              }
              auVar235 = ZEXT464(uVar78);
              auVar232 = ZEXT464(uVar134);
              bVar68 = ~bVar69;
              lVar74 = 5;
              do {
                fVar221 = auVar232._0_4_;
                auVar148._4_4_ = fVar221;
                auVar148._0_4_ = fVar221;
                auVar148._8_4_ = fVar221;
                auVar148._12_4_ = fVar221;
                auVar81 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_690);
                fVar229 = auVar235._0_4_;
                fVar198 = 1.0 - fVar229;
                auVar80 = SUB6416(ZEXT464(0x40400000),0);
                auVar84 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar234 = auVar235._0_16_;
                auVar79 = vfmadd213ss_fma(auVar80,auVar234,auVar84);
                auVar82 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar229 * fVar229)),
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar83 = vfmadd213ss_fma(auVar80,ZEXT416((uint)fVar198),auVar84);
                auVar83 = vfmadd213ss_fma(auVar83,ZEXT416((uint)(fVar198 * fVar198)),
                                          SUB6416(ZEXT464(0x40000000),0));
                fVar222 = fVar198 * fVar198 * -fVar229 * 0.5;
                fVar223 = auVar82._0_4_ * 0.5;
                fVar224 = auVar83._0_4_ * 0.5;
                fVar225 = fVar229 * fVar229 * -fVar198 * 0.5;
                auVar202._0_4_ = fVar225 * (float)local_680._0_4_;
                auVar202._4_4_ = fVar225 * (float)local_680._4_4_;
                auVar202._8_4_ = fVar225 * fStack_678;
                auVar202._12_4_ = fVar225 * fStack_674;
                auVar212._4_4_ = fVar224;
                auVar212._0_4_ = fVar224;
                auVar212._8_4_ = fVar224;
                auVar212._12_4_ = fVar224;
                auVar82 = vfmadd132ps_fma(auVar212,auVar202,local_640._0_16_);
                auVar190._4_4_ = fVar223;
                auVar190._0_4_ = fVar223;
                auVar190._8_4_ = fVar223;
                auVar190._12_4_ = fVar223;
                auVar82 = vfmadd132ps_fma(auVar190,auVar82,local_660._0_16_);
                auVar203._4_4_ = fVar222;
                auVar203._0_4_ = fVar222;
                auVar203._8_4_ = fVar222;
                auVar203._12_4_ = fVar222;
                auVar82 = vfmadd132ps_fma(auVar203,auVar82,local_620._0_16_);
                local_570 = vfmadd231ss_fma(auVar84,auVar234,ZEXT416(0x41100000));
                local_580 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar234,
                                            ZEXT416(0x40800000));
                local_590 = vfmadd213ss_fma(auVar80,auVar234,ZEXT416(0xbf800000));
                local_520._0_16_ = auVar82;
                auVar81 = vsubps_avx(auVar81,auVar82);
                local_800._0_16_ = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                fVar222 = auVar81._0_4_;
                if (fVar222 < 0.0) {
                  local_7c0._0_4_ = auVar79._0_4_;
                  local_7e0._0_16_ = ZEXT416((uint)fVar198);
                  auVar235._0_4_ = sqrtf(fVar222);
                  auVar235._4_60_ = extraout_var_00;
                  auVar79 = ZEXT416((uint)local_7c0._0_4_);
                  auVar82 = auVar235._0_16_;
                  auVar83 = local_7e0._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar81,auVar81);
                  auVar83 = ZEXT416((uint)fVar198);
                }
                fVar223 = auVar83._0_4_;
                auVar80 = vfnmadd231ss_fma(ZEXT416((uint)(fVar229 * (fVar223 + fVar223))),auVar83,
                                           auVar83);
                auVar79 = vfmadd213ss_fma(auVar79,ZEXT416((uint)(fVar229 + fVar229)),
                                          ZEXT416((uint)(fVar229 * fVar229 * 3.0)));
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar234,
                                          SUB6416(ZEXT464(0x40000000),0));
                auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * fVar223 * -3.0)),
                                          ZEXT416((uint)(fVar223 + fVar223)),auVar83);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)(fVar198 * -2.0)),auVar234,
                                          ZEXT416((uint)(fVar229 * fVar229)));
                fVar223 = auVar80._0_4_ * 0.5;
                fVar224 = auVar79._0_4_ * 0.5;
                fVar225 = auVar84._0_4_ * 0.5;
                fVar198 = auVar83._0_4_ * 0.5;
                auVar204._0_4_ = fVar198 * (float)local_680._0_4_;
                auVar204._4_4_ = fVar198 * (float)local_680._4_4_;
                auVar204._8_4_ = fVar198 * fStack_678;
                auVar204._12_4_ = fVar198 * fStack_674;
                auVar191._4_4_ = fVar225;
                auVar191._0_4_ = fVar225;
                auVar191._8_4_ = fVar225;
                auVar191._12_4_ = fVar225;
                auVar79 = vfmadd132ps_fma(auVar191,auVar204,local_640._0_16_);
                auVar171._4_4_ = fVar224;
                auVar171._0_4_ = fVar224;
                auVar171._8_4_ = fVar224;
                auVar171._12_4_ = fVar224;
                auVar79 = vfmadd132ps_fma(auVar171,auVar79,local_660._0_16_);
                auVar244._4_4_ = fVar223;
                auVar244._0_4_ = fVar223;
                auVar244._8_4_ = fVar223;
                auVar244._12_4_ = fVar223;
                local_7c0._0_16_ = vfmadd132ps_fma(auVar244,auVar79,local_620._0_16_);
                auVar79 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar223 = auVar79._0_4_;
                auVar83 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar223));
                fVar224 = auVar83._0_4_;
                auVar84 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar223));
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                auVar80 = vxorps_avx512vl(auVar79,auVar17);
                auVar83 = vfnmadd213ss_fma(auVar84,auVar79,SUB6416(ZEXT464(0x40000000),0));
                local_7e0._0_4_ = auVar82._0_4_;
                if (fVar223 < auVar80._0_4_) {
                  fVar225 = sqrtf(fVar223);
                  auVar82 = ZEXT416((uint)local_7e0._0_4_);
                  auVar79 = local_7c0._0_16_;
                }
                else {
                  auVar79 = vsqrtss_avx(auVar79,auVar79);
                  fVar225 = auVar79._0_4_;
                  auVar79 = local_7c0._0_16_;
                }
                fVar224 = fVar224 * 1.5 + fVar223 * -0.5 * fVar224 * fVar224 * fVar224;
                auVar149._0_4_ = auVar79._0_4_ * fVar224;
                auVar149._4_4_ = auVar79._4_4_ * fVar224;
                auVar149._8_4_ = auVar79._8_4_ * fVar224;
                auVar149._12_4_ = auVar79._12_4_ * fVar224;
                auVar80 = vdpps_avx(local_800._0_16_,auVar149,0x7f);
                fVar227 = auVar82._0_4_;
                auVar150._0_4_ = auVar80._0_4_ * auVar80._0_4_;
                auVar150._4_4_ = auVar80._4_4_ * auVar80._4_4_;
                auVar150._8_4_ = auVar80._8_4_ * auVar80._8_4_;
                auVar150._12_4_ = auVar80._12_4_ * auVar80._12_4_;
                auVar85 = vsubps_avx512vl(auVar81,auVar150);
                fVar198 = auVar85._0_4_;
                auVar172._4_12_ = ZEXT812(0) << 0x20;
                auVar172._0_4_ = fVar198;
                auVar86 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
                auVar87 = vmulss_avx512f(auVar86,ZEXT416(0x3fc00000));
                if (fVar198 < 0.0) {
                  local_5c0 = fVar224;
                  fStack_5bc = fVar224;
                  fStack_5b8 = fVar224;
                  fStack_5b4 = fVar224;
                  local_5b0 = auVar86;
                  local_5a0 = auVar80;
                  fVar143 = sqrtf(fVar198);
                  auVar87 = ZEXT416(auVar87._0_4_);
                  auVar82 = ZEXT416((uint)local_7e0._0_4_);
                  auVar79 = local_7c0._0_16_;
                  auVar80 = local_5a0;
                  auVar86 = local_5b0;
                  fVar224 = local_5c0;
                  fVar230 = fStack_5bc;
                  fVar231 = fStack_5b8;
                  fVar233 = fStack_5b4;
                }
                else {
                  auVar85 = vsqrtss_avx(auVar85,auVar85);
                  fVar143 = auVar85._0_4_;
                  fVar230 = fVar224;
                  fVar231 = fVar224;
                  fVar233 = fVar224;
                }
                auVar245 = ZEXT1664(auVar79);
                auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar255 = ZEXT3264(auVar94);
                auVar253 = ZEXT3264(local_820);
                auVar257 = ZEXT3264(local_840);
                auVar246 = ZEXT3264(local_860);
                auVar247 = ZEXT3264(local_700);
                auVar248 = ZEXT3264(local_720);
                auVar249 = ZEXT3264(local_880);
                auVar251 = ZEXT3264(local_740);
                auVar250 = ZEXT3264(local_8a0);
                auVar252 = ZEXT3264(local_8c0);
                auVar254 = ZEXT3264(local_760);
                auVar256 = ZEXT3264(local_780);
                auVar258 = ZEXT3264(local_7a0);
                auVar173._0_4_ = (float)local_590._0_4_ * (float)local_680._0_4_;
                auVar173._4_4_ = (float)local_590._0_4_ * (float)local_680._4_4_;
                auVar173._8_4_ = (float)local_590._0_4_ * fStack_678;
                auVar173._12_4_ = (float)local_590._0_4_ * fStack_674;
                auVar192._4_4_ = local_580._0_4_;
                auVar192._0_4_ = local_580._0_4_;
                auVar192._8_4_ = local_580._0_4_;
                auVar192._12_4_ = local_580._0_4_;
                auVar85 = vfmadd132ps_fma(auVar192,auVar173,local_640._0_16_);
                auVar174._4_4_ = local_570._0_4_;
                auVar174._0_4_ = local_570._0_4_;
                auVar174._8_4_ = local_570._0_4_;
                auVar174._12_4_ = local_570._0_4_;
                auVar85 = vfmadd132ps_fma(auVar174,auVar85,local_660._0_16_);
                auVar234 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar234,
                                           ZEXT416(0x40000000));
                auVar193._0_4_ = auVar234._0_4_;
                auVar193._4_4_ = auVar193._0_4_;
                auVar193._8_4_ = auVar193._0_4_;
                auVar193._12_4_ = auVar193._0_4_;
                auVar234 = vfmadd132ps_fma(auVar193,auVar85,local_620._0_16_);
                auVar175._0_4_ = auVar234._0_4_ * fVar223;
                auVar175._4_4_ = auVar234._4_4_ * fVar223;
                auVar175._8_4_ = auVar234._8_4_ * fVar223;
                auVar175._12_4_ = auVar234._12_4_ * fVar223;
                auVar234 = vdpps_avx(auVar79,auVar234,0x7f);
                fVar223 = auVar234._0_4_;
                auVar194._0_4_ = auVar79._0_4_ * fVar223;
                auVar194._4_4_ = auVar79._4_4_ * fVar223;
                auVar194._8_4_ = auVar79._8_4_ * fVar223;
                auVar194._12_4_ = auVar79._12_4_ * fVar223;
                auVar85 = vsubps_avx(auVar175,auVar194);
                local_920 = auVar84._0_4_;
                local_920 = auVar83._0_4_ * local_920;
                auVar234 = vmaxss_avx(ZEXT416((uint)fVar226),
                                      ZEXT416((uint)(fVar221 * fVar218 * 1.9073486e-06)));
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar132._16_16_ = local_7a0._16_16_;
                auVar88 = vxorps_avx512vl(auVar79,auVar18);
                auVar195._0_4_ = fVar224 * auVar85._0_4_ * local_920;
                auVar195._4_4_ = fVar230 * auVar85._4_4_ * local_920;
                auVar195._8_4_ = fVar231 * auVar85._8_4_ * local_920;
                auVar195._12_4_ = fVar233 * auVar85._12_4_ * local_920;
                auVar240 = ZEXT1664(auVar149);
                auVar83 = vdpps_avx(auVar88,auVar149,0x7f);
                auVar84 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar226),auVar234);
                auVar82 = vdpps_avx(local_800._0_16_,auVar195,0x7f);
                auVar85 = vfmadd213ss_fma(ZEXT416((uint)(fVar227 + 1.0)),
                                          ZEXT416((uint)(fVar226 / fVar225)),auVar84);
                fVar223 = auVar83._0_4_ + auVar82._0_4_;
                auVar82 = vdpps_avx(local_690,auVar149,0x7f);
                auVar83 = vdpps_avx(local_800._0_16_,auVar88,0x7f);
                fVar224 = auVar86._0_4_;
                auVar88 = vaddss_avx512f(auVar87,ZEXT416((uint)(fVar224 * fVar198 * -0.5 *
                                                               fVar224 * fVar224)));
                auVar84 = vdpps_avx(local_800._0_16_,local_690,0x7f);
                auVar86 = vfnmadd231ss_fma(auVar83,auVar80,ZEXT416((uint)fVar223));
                auVar87 = vfnmadd231ss_fma(auVar84,auVar80,auVar82);
                auVar83 = vpermilps_avx(local_520._0_16_,0xff);
                fVar143 = fVar143 - auVar83._0_4_;
                auVar83 = vshufps_avx(auVar79,auVar79,0xff);
                auVar84 = vfmsub213ss_fma(auVar86,auVar88,auVar83);
                fVar224 = auVar87._0_4_ * auVar88._0_4_;
                auVar86 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar84._0_4_)),
                                          ZEXT416((uint)fVar223),ZEXT416((uint)fVar224));
                fVar225 = auVar86._0_4_;
                fVar229 = fVar229 - (auVar80._0_4_ * (fVar224 / fVar225) -
                                    fVar143 * (auVar82._0_4_ / fVar225));
                auVar235 = ZEXT464((uint)fVar229);
                fVar221 = fVar221 - (fVar143 * (fVar223 / fVar225) -
                                    auVar80._0_4_ * (auVar84._0_4_ / fVar225));
                auVar232 = ZEXT464((uint)fVar221);
                auVar213._8_4_ = 0x7fffffff;
                auVar213._0_8_ = 0x7fffffff7fffffff;
                auVar213._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx(auVar80,auVar213);
                bVar75 = true;
                if (auVar82._0_4_ < auVar85._0_4_) {
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar85._0_4_ + auVar234._0_4_)),
                                            local_5e0,ZEXT416(0x36000000));
                  auVar82 = vandps_avx(ZEXT416((uint)fVar143),auVar213);
                  if (auVar82._0_4_ < auVar84._0_4_) {
                    fVar221 = fVar221 + (float)local_5d0._0_4_;
                    auVar232 = ZEXT464((uint)fVar221);
                    if ((((fVar141 <= fVar221) &&
                         (fVar223 = *(float *)(ray + k * 4 + 0x80), fVar221 <= fVar223)) &&
                        (0.0 <= fVar229)) && (fVar229 <= 1.0)) {
                      auVar132._0_16_ = ZEXT816(0) << 0x20;
                      auVar131._4_28_ = auVar132._4_28_;
                      auVar131._0_4_ = fVar222;
                      auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar131._0_16_);
                      fVar222 = auVar82._0_4_;
                      auVar81 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                      pGVar2 = (context->scene->geometries).items[local_8e8].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          bVar69 = true;
                        }
                        else {
                          fVar222 = fVar222 * 1.5 + auVar81._0_4_ * fVar222 * fVar222 * fVar222;
                          auVar176._0_4_ = local_800._0_4_ * fVar222;
                          auVar176._4_4_ = local_800._4_4_ * fVar222;
                          auVar176._8_4_ = local_800._8_4_ * fVar222;
                          auVar176._12_4_ = local_800._12_4_ * fVar222;
                          auVar84 = vfmadd213ps_fma(auVar83,auVar176,auVar79);
                          auVar81 = vshufps_avx(auVar176,auVar176,0xc9);
                          auVar82 = vshufps_avx(auVar79,auVar79,0xc9);
                          auVar177._0_4_ = auVar176._0_4_ * auVar82._0_4_;
                          auVar177._4_4_ = auVar176._4_4_ * auVar82._4_4_;
                          auVar177._8_4_ = auVar176._8_4_ * auVar82._8_4_;
                          auVar177._12_4_ = auVar176._12_4_ * auVar82._12_4_;
                          auVar83 = vfmsub231ps_fma(auVar177,auVar79,auVar81);
                          auVar81 = vshufps_avx(auVar83,auVar83,0xc9);
                          auVar82 = vshufps_avx(auVar84,auVar84,0xc9);
                          auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                          auVar151._0_4_ = auVar84._0_4_ * auVar83._0_4_;
                          auVar151._4_4_ = auVar84._4_4_ * auVar83._4_4_;
                          auVar151._8_4_ = auVar84._8_4_ * auVar83._8_4_;
                          auVar151._12_4_ = auVar84._12_4_ * auVar83._12_4_;
                          auVar81 = vfmsub231ps_fma(auVar151,auVar81,auVar82);
                          local_4c0 = (RTCHitN  [16])vshufps_avx(auVar81,auVar81,0x55);
                          auStack_4b0 = vshufps_avx(auVar81,auVar81,0xaa);
                          local_4a0 = auVar81._0_4_;
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          local_490 = fVar229;
                          fStack_48c = fVar229;
                          fStack_488 = fVar229;
                          fStack_484 = fVar229;
                          local_480 = ZEXT416(0) << 0x20;
                          local_470 = local_4d0._0_8_;
                          uStack_468 = local_4d0._8_8_;
                          local_460 = local_4e0;
                          vpcmpeqd_avx2(ZEXT1632(local_4e0),ZEXT1632(local_4e0));
                          uStack_44c = context->user->instID[0];
                          local_450 = uStack_44c;
                          uStack_448 = uStack_44c;
                          uStack_444 = uStack_44c;
                          uStack_440 = context->user->instPrimID[0];
                          uStack_43c = uStack_440;
                          uStack_438 = uStack_440;
                          uStack_434 = uStack_440;
                          *(float *)(ray + k * 4 + 0x80) = fVar221;
                          local_900 = local_4f0._0_8_;
                          uStack_8f8 = local_4f0._8_8_;
                          local_6d0.valid = (int *)&local_900;
                          local_6d0.geometryUserPtr = pGVar2->userPtr;
                          local_6d0.context = context->user;
                          local_6d0.hit = local_4c0;
                          local_6d0.N = 4;
                          local_6d0.ray = (RTCRayN *)ray;
                          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar240 = ZEXT1664(auVar149);
                            auVar245 = ZEXT1664(auVar79);
                            (*pGVar2->occlusionFilterN)(&local_6d0);
                            auVar232 = ZEXT1664(ZEXT416((uint)fVar221));
                            auVar235 = ZEXT1664(ZEXT416((uint)fVar229));
                            auVar258 = ZEXT3264(local_7a0);
                            auVar256 = ZEXT3264(local_780);
                            auVar254 = ZEXT3264(local_760);
                            auVar252 = ZEXT3264(local_8c0);
                            auVar250 = ZEXT3264(local_8a0);
                            auVar251 = ZEXT3264(local_740);
                            auVar249 = ZEXT3264(local_880);
                            auVar248 = ZEXT3264(local_720);
                            auVar247 = ZEXT3264(local_700);
                            auVar246 = ZEXT3264(local_860);
                            auVar257 = ZEXT3264(local_840);
                            auVar253 = ZEXT3264(local_820);
                            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar255 = ZEXT3264(auVar94);
                          }
                          auVar62._8_8_ = uStack_8f8;
                          auVar62._0_8_ = local_900;
                          uVar77 = vptestmd_avx512vl(auVar62,auVar62);
                          if ((uVar77 & 0xf) == 0) {
                            bVar69 = false;
                          }
                          else {
                            p_Var3 = context->args->filter;
                            if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar240 = ZEXT1664(auVar240._0_16_);
                              auVar245 = ZEXT1664(auVar245._0_16_);
                              (*p_Var3)(&local_6d0);
                              auVar232 = ZEXT1664(ZEXT416((uint)fVar221));
                              auVar235 = ZEXT1664(ZEXT416((uint)fVar229));
                              auVar258 = ZEXT3264(local_7a0);
                              auVar256 = ZEXT3264(local_780);
                              auVar254 = ZEXT3264(local_760);
                              auVar252 = ZEXT3264(local_8c0);
                              auVar250 = ZEXT3264(local_8a0);
                              auVar251 = ZEXT3264(local_740);
                              auVar249 = ZEXT3264(local_880);
                              auVar248 = ZEXT3264(local_720);
                              auVar247 = ZEXT3264(local_700);
                              auVar246 = ZEXT3264(local_860);
                              auVar257 = ZEXT3264(local_840);
                              auVar253 = ZEXT3264(local_820);
                              auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar255 = ZEXT3264(auVar94);
                            }
                            auVar63._8_8_ = uStack_8f8;
                            auVar63._0_8_ = local_900;
                            uVar77 = vptestmd_avx512vl(auVar63,auVar63);
                            uVar77 = uVar77 & 0xf;
                            auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                            bVar75 = (bool)((byte)uVar77 & 1);
                            bVar4 = (bool)((byte)(uVar77 >> 1) & 1);
                            bVar5 = (bool)((byte)(uVar77 >> 2) & 1);
                            bVar6 = SUB81(uVar77 >> 3,0);
                            *(uint *)(local_6d0.ray + 0x80) =
                                 (uint)bVar75 * auVar81._0_4_ |
                                 (uint)!bVar75 * *(int *)(local_6d0.ray + 0x80);
                            *(uint *)(local_6d0.ray + 0x84) =
                                 (uint)bVar4 * auVar81._4_4_ |
                                 (uint)!bVar4 * *(int *)(local_6d0.ray + 0x84);
                            *(uint *)(local_6d0.ray + 0x88) =
                                 (uint)bVar5 * auVar81._8_4_ |
                                 (uint)!bVar5 * *(int *)(local_6d0.ray + 0x88);
                            *(uint *)(local_6d0.ray + 0x8c) =
                                 (uint)bVar6 * auVar81._12_4_ |
                                 (uint)!bVar6 * *(int *)(local_6d0.ray + 0x8c);
                            bVar69 = (byte)uVar77 != 0;
                          }
                          if ((bool)bVar69 == false) {
                            *(float *)(ray + k * 4 + 0x80) = fVar223;
                          }
                        }
                        bVar75 = false;
                        goto LAB_01daefb1;
                      }
                    }
                    bVar75 = false;
                    bVar69 = 0;
                  }
                }
LAB_01daefb1:
                if (!bVar75) goto LAB_01daf393;
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              bVar69 = 0;
LAB_01daf393:
              bVar72 = bVar72 | bVar69 & 1;
              auVar65._4_4_ = fStack_3dc;
              auVar65._0_4_ = local_3e0;
              auVar65._8_4_ = fStack_3d8;
              auVar65._12_4_ = fStack_3d4;
              auVar65._16_4_ = fStack_3d0;
              auVar65._20_4_ = fStack_3cc;
              auVar65._24_4_ = fStack_3c8;
              auVar65._28_4_ = fStack_3c4;
              uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar31._4_4_ = uVar142;
              auVar31._0_4_ = uVar142;
              auVar31._8_4_ = uVar142;
              auVar31._12_4_ = uVar142;
              auVar31._16_4_ = uVar142;
              auVar31._20_4_ = uVar142;
              auVar31._24_4_ = uVar142;
              auVar31._28_4_ = uVar142;
              uVar11 = vcmpps_avx512vl(auVar65,auVar31,2);
              bVar73 = bVar68 & bVar73 & (byte)uVar11;
            } while (bVar73 != 0);
          }
          uVar12 = vpcmpd_avx512vl(local_380,_local_400,1);
          uVar13 = vpcmpd_avx512vl(local_380,local_2e0,1);
          auVar179._0_4_ = (float)local_420._0_4_ + (float)local_1c0._0_4_;
          auVar179._4_4_ = (float)local_420._4_4_ + (float)local_1c0._4_4_;
          auVar179._8_4_ = fStack_418 + fStack_1b8;
          auVar179._12_4_ = fStack_414 + fStack_1b4;
          auVar179._16_4_ = fStack_410 + fStack_1b0;
          auVar179._20_4_ = fStack_40c + fStack_1ac;
          auVar179._24_4_ = fStack_408 + fStack_1a8;
          auVar179._28_4_ = fStack_404 + fStack_1a4;
          uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar197._4_4_ = uVar142;
          auVar197._0_4_ = uVar142;
          auVar197._8_4_ = uVar142;
          auVar197._12_4_ = uVar142;
          auVar197._16_4_ = uVar142;
          auVar197._20_4_ = uVar142;
          auVar197._24_4_ = uVar142;
          auVar197._28_4_ = uVar142;
          uVar11 = vcmpps_avx512vl(auVar179,auVar197,2);
          bVar73 = (byte)local_8d0 & (byte)uVar13 & (byte)uVar11;
          auVar208._0_4_ = (float)local_420._0_4_ + (float)local_320._0_4_;
          auVar208._4_4_ = (float)local_420._4_4_ + (float)local_320._4_4_;
          auVar208._8_4_ = fStack_418 + fStack_318;
          auVar208._12_4_ = fStack_414 + fStack_314;
          auVar208._16_4_ = fStack_410 + fStack_310;
          auVar208._20_4_ = fStack_40c + fStack_30c;
          auVar208._24_4_ = fStack_408 + fStack_308;
          auVar208._28_4_ = fStack_404 + fStack_304;
          uVar11 = vcmpps_avx512vl(auVar208,auVar197,2);
          bVar67 = bVar67 & (byte)uVar12 & (byte)uVar11 | bVar73;
          prim = local_6e0;
          if (bVar67 != 0) {
            local_180[uVar70 * 0x60] = bVar67;
            bVar75 = (bool)(bVar73 >> 1 & 1);
            bVar4 = (bool)(bVar73 >> 2 & 1);
            bVar5 = (bool)(bVar73 >> 3 & 1);
            bVar6 = (bool)(bVar73 >> 4 & 1);
            bVar7 = (bool)(bVar73 >> 5 & 1);
            bVar8 = (bool)(bVar73 >> 6 & 1);
            auStack_160[uVar70 * 0x18] =
                 (uint)(bVar73 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar73 & 1) * local_320._0_4_;
            auStack_160[uVar70 * 0x18 + 1] =
                 (uint)bVar75 * local_1c0._4_4_ | (uint)!bVar75 * local_320._4_4_;
            auStack_160[uVar70 * 0x18 + 2] =
                 (uint)bVar4 * (int)fStack_1b8 | (uint)!bVar4 * (int)fStack_318;
            auStack_160[uVar70 * 0x18 + 3] =
                 (uint)bVar5 * (int)fStack_1b4 | (uint)!bVar5 * (int)fStack_314;
            auStack_160[uVar70 * 0x18 + 4] =
                 (uint)bVar6 * (int)fStack_1b0 | (uint)!bVar6 * (int)fStack_310;
            local_140[uVar70 * 0x18 + -3] =
                 (float)((uint)bVar7 * (int)fStack_1ac | (uint)!bVar7 * (int)fStack_30c);
            local_140[uVar70 * 0x18 + -2] =
                 (float)((uint)bVar8 * (int)fStack_1a8 | (uint)!bVar8 * (int)fStack_308);
            local_140[uVar70 * 0x18 + -1] =
                 (float)((uint)(bVar73 >> 7) * (int)fStack_1a4 |
                        (uint)!(bool)(bVar73 >> 7) * (int)fStack_304);
            uVar11 = vmovlps_avx(local_5f0);
            *(undefined8 *)(local_140 + uVar70 * 0x18) = uVar11;
            local_138[uVar70 * 0x18] = (int)local_8e0 + 1;
            uVar70 = (ulong)((int)uVar70 + 1);
          }
        }
      }
      auVar209 = ZEXT3264(_local_560);
    }
    do {
      if ((int)uVar70 == 0) {
        if (bVar72 != 0) {
          return bVar76;
        }
        uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar33._4_4_ = uVar142;
        auVar33._0_4_ = uVar142;
        auVar33._8_4_ = uVar142;
        auVar33._12_4_ = uVar142;
        auVar33._16_4_ = uVar142;
        auVar33._20_4_ = uVar142;
        auVar33._24_4_ = uVar142;
        auVar33._28_4_ = uVar142;
        uVar11 = vcmpps_avx512vl(local_2c0,auVar33,2);
        uVar78 = (uint)local_6d8 & (uint)uVar11;
        local_6d8 = (ulong)uVar78;
        bVar76 = uVar78 != 0;
        if (!bVar76) {
          return bVar76;
        }
        goto LAB_01dacb58;
      }
      uVar77 = (ulong)((int)uVar70 - 1);
      auVar94 = *(undefined1 (*) [32])(auStack_160 + uVar77 * 0x18);
      auVar180._0_4_ = auVar94._0_4_ + (float)local_420._0_4_;
      auVar180._4_4_ = auVar94._4_4_ + (float)local_420._4_4_;
      auVar180._8_4_ = auVar94._8_4_ + fStack_418;
      auVar180._12_4_ = auVar94._12_4_ + fStack_414;
      auVar180._16_4_ = auVar94._16_4_ + fStack_410;
      auVar180._20_4_ = auVar94._20_4_ + fStack_40c;
      auVar180._24_4_ = auVar94._24_4_ + fStack_408;
      auVar180._28_4_ = auVar94._28_4_ + fStack_404;
      uVar142 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar142;
      auVar32._0_4_ = uVar142;
      auVar32._8_4_ = uVar142;
      auVar32._12_4_ = uVar142;
      auVar32._16_4_ = uVar142;
      auVar32._20_4_ = uVar142;
      auVar32._24_4_ = uVar142;
      auVar32._28_4_ = uVar142;
      uVar11 = vcmpps_avx512vl(auVar180,auVar32,2);
      uVar78 = (uint)uVar11 & (uint)local_180[uVar77 * 0x60];
      bVar67 = (byte)uVar78;
      if (uVar78 != 0) {
        auVar181._8_4_ = 0x7f800000;
        auVar181._0_8_ = 0x7f8000007f800000;
        auVar181._12_4_ = 0x7f800000;
        auVar181._16_4_ = 0x7f800000;
        auVar181._20_4_ = 0x7f800000;
        auVar181._24_4_ = 0x7f800000;
        auVar181._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar181,auVar94);
        auVar133._0_4_ =
             (uint)(bVar67 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar67 & 1) * (int)auVar94._0_4_;
        bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * (int)auVar94._4_4_;
        bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * (int)auVar94._8_4_;
        bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * (int)auVar94._12_4_;
        bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * (int)auVar94._16_4_;
        bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * (int)auVar94._20_4_;
        bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * (int)auVar94._24_4_;
        auVar133._28_4_ =
             (uVar78 >> 7) * auVar93._28_4_ | (uint)!SUB41(uVar78 >> 7,0) * (int)auVar94._28_4_;
        auVar94 = vshufps_avx(auVar133,auVar133,0xb1);
        auVar94 = vminps_avx(auVar133,auVar94);
        auVar93 = vshufpd_avx(auVar94,auVar94,5);
        auVar94 = vminps_avx(auVar94,auVar93);
        auVar93 = vpermpd_avx2(auVar94,0x4e);
        auVar94 = vminps_avx(auVar94,auVar93);
        uVar11 = vcmpps_avx512vl(auVar133,auVar94,0);
        bVar73 = (byte)uVar11 & bVar67;
        if (bVar73 != 0) {
          uVar78 = (uint)bVar73;
        }
        fVar226 = local_140[uVar77 * 0x18 + 1];
        uVar134 = 0;
        for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
          uVar134 = uVar134 + 1;
        }
        local_8e0 = (ulong)local_138[uVar77 * 0x18];
        bVar73 = ~('\x01' << ((byte)uVar134 & 0x1f)) & bVar67;
        local_180[uVar77 * 0x60] = bVar73;
        uVar71 = uVar77;
        if (bVar73 != 0) {
          uVar71 = uVar70;
        }
        fVar218 = local_140[uVar77 * 0x18];
        auVar182._4_4_ = fVar218;
        auVar182._0_4_ = fVar218;
        auVar182._8_4_ = fVar218;
        auVar182._12_4_ = fVar218;
        auVar182._16_4_ = fVar218;
        auVar182._20_4_ = fVar218;
        auVar182._24_4_ = fVar218;
        auVar182._28_4_ = fVar218;
        fVar226 = fVar226 - fVar218;
        auVar163._4_4_ = fVar226;
        auVar163._0_4_ = fVar226;
        auVar163._8_4_ = fVar226;
        auVar163._12_4_ = fVar226;
        auVar163._16_4_ = fVar226;
        auVar163._20_4_ = fVar226;
        auVar163._24_4_ = fVar226;
        auVar163._28_4_ = fVar226;
        auVar81 = vfmadd132ps_fma(auVar163,auVar182,_DAT_02020f20);
        _local_4c0 = ZEXT1632(auVar81);
        local_5f0._8_8_ = 0;
        local_5f0._0_8_ = *(ulong *)(local_4c0 + (ulong)uVar134 * 4);
        uVar77 = uVar71;
      }
      uVar70 = uVar77;
    } while (bVar67 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }